

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::handleMessage
          (RpcConnectionState *this,Own<capnp::IncomingRpcMessage> *message)

{
  uint *puVar1;
  PromiseNode **ppPVar2;
  Exception *exception;
  byte bVar3;
  undefined8 *puVar4;
  IncomingRpcMessage *pIVar5;
  PromiseNode *pPVar6;
  uint *puVar7;
  size_t sVar8;
  ArrayDisposer *pAVar9;
  _func_int **pp_Var10;
  _func_int **pp_Var11;
  PromiseFulfiller<void> *pPVar12;
  PromiseFulfiller<kj::Own<capnp::ClientHook>_> *pPVar13;
  PromiseFulfiller<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>
  *pPVar14;
  Builder builder;
  Reader capTable;
  Reader descriptor;
  Reader capTable_00;
  ErrorHandler *pEVar15;
  ErrorHandler *pEVar16;
  ErrorHandler *pEVar17;
  undefined8 uVar18;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar19;
  StructDataBitCount SVar20;
  undefined8 uVar21;
  undefined2 uVar22;
  uint uVar23;
  Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Answer_&> MVar24;
  mapped_type *pmVar25;
  PipelineHook *pPVar26;
  Embargo *pEVar27;
  RpcCallContext *pRVar28;
  long *plVar29;
  RpcConnectionState *pRVar30;
  TransformPromiseNodeBase *pTVar31;
  Maybe<capnp::_::(anonymous_namespace)::RpcConnectionState::Import_&> MVar32;
  RpcCallContext *this_00;
  RpcConnectionState *pRVar33;
  AttachmentPromiseNodeBase *pAVar34;
  SegmentReader *pSVar35;
  Refcounted *refcounted_2;
  Question *entry;
  uint64_t methodId;
  uint refcount;
  ulong uVar36;
  CapTableReader *pCVar37;
  short sVar38;
  int iVar39;
  undefined4 uVar40;
  Disposer *disposerCopy;
  Own<kj::_::PromiseNode> *pOVar41;
  bool bVar42;
  uint uVar43;
  RpcConnectionState *pRVar44;
  RpcConnectionState *pRVar45;
  undefined8 uVar46;
  ulong uVar47;
  _func_int *p_Var48;
  RpcCallContext *ptrCopy;
  Question *pQVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  uint16_t uVar53;
  ExportId id;
  Refcounted *refcounted_3;
  QuestionRef *this_01;
  PipelineHook *pPVar54;
  Disposer *disposerCopy_1;
  Disposer *pDVar55;
  MessageSizeCounts MVar56;
  Own<capnp::ClientHook> OVar57;
  Maybe<kj::Own<capnp::ClientHook>_> MVar58;
  Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> PVar59;
  Own<capnp::OutgoingRpcMessage> message_1;
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:2346:36),_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>_>,_void>
  resultsPromise;
  ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_> forked;
  Refcounted *refcounted;
  Fault f_2;
  Own<capnp::ClientHook> capability;
  VoidPromiseAndPipeline promiseAndPipeline;
  ReaderFor<capnp::rpc::Message> reader;
  PromiseFulfillerPair<void> cancelPaf;
  Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> capTableArray;
  Reader payload;
  Fault f_3;
  undefined1 local_4a8 [16];
  RpcConnectionState *local_498;
  Own<kj::_::PromiseNode> local_488;
  RpcConnectionState *local_478;
  Own<kj::_::PromiseNode> local_468;
  Own<kj::_::PromiseNode> *local_458;
  undefined1 local_450 [8];
  RpcConnectionState *pRStack_448;
  RpcConnectionState *local_440;
  RpcConnectionState *local_438;
  undefined8 local_430;
  RpcCallContext *local_428;
  Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *local_420;
  Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> local_418;
  undefined1 local_3f8 [16];
  WirePointer *local_3e8;
  RpcConnectionState *pRStack_3e0;
  uint local_3d8;
  StructPointerCount local_3d4;
  anon_union_24_1_a8c68091_for_NullableValue<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>_2
  local_3d0;
  undefined1 local_3b8 [48];
  Own<kj::_::PromiseNode> local_388;
  undefined1 local_378 [80];
  undefined1 local_328 [32];
  undefined1 local_308 [24];
  int iStack_2f0;
  undefined4 uStack_2ec;
  anon_union_16_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>_2
  local_2e8 [3];
  undefined8 local_2b8;
  undefined1 local_2b0 [264];
  RpcConnectionState *local_1a8;
  undefined1 local_1a0 [8];
  undefined1 local_198 [72];
  undefined1 auStack_150 [16];
  undefined1 local_140 [272];
  
  (**message->ptr->_vptr_IncomingRpcMessage)(local_198);
  local_308._16_8_ = local_198._16_8_;
  _iStack_2f0 = local_198._24_8_;
  local_308._0_8_ = local_198._0_8_;
  local_308._8_8_ = local_198._8_8_;
  uVar22 = 0;
  PointerReader::getStruct((StructReader *)local_3b8,(PointerReader *)local_308,(word *)0x0);
  if (0xf < (uint)local_3b8._32_4_) {
    uVar22 = *(undefined2 *)local_3b8._16_8_;
  }
  switch(uVar22) {
  case 0:
    if (local_3b8._36_2_ == 0) {
      local_3b8._40_4_ = 0x7fffffff;
      local_3b8._8_8_ = (RpcConnectionState *)0x0;
      local_3b8._24_8_ = (RpcConnectionState *)0x0;
      local_3b8._0_8_ = (RpcConnectionState *)0x0;
    }
    iStack_2f0 = local_3b8._40_4_;
    uVar23 = 0;
    local_308._0_8_ = local_3b8._0_8_;
    local_308._8_8_ = local_3b8._8_8_;
    local_308._16_8_ = local_3b8._24_8_;
    PointerReader::getStruct((StructReader *)local_3f8,(PointerReader *)local_308,(word *)0x0);
    if (local_3d8 < 0x10) {
LAB_003c2c0e:
      local_198._0_4_ = uVar23;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50],unsigned_int>
                ((Fault *)local_308,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x88f,FAILED,(char *)0x0,
                 "\"Peer did not implement required RPC message type.\", (uint)message.which()",
                 (char (*) [50])"Peer did not implement required RPC message type.",
                 (uint *)local_198);
      kj::_::Debug::Fault::fatal((Fault *)local_308);
    }
    if (*(short *)&((ErrorHandler *)&local_3e8->offsetAndKind)->_vptr_ErrorHandler != 5) {
      uVar23 = (uint)*(ushort *)&((ErrorHandler *)&local_3e8->offsetAndKind)->_vptr_ErrorHandler;
      goto LAB_003c2c0e;
    }
    if (local_3d4 == 0) {
      local_3d0._0_4_ = 0x7fffffff;
      local_3f8._8_8_ = (RpcConnectionState *)0x0;
      pRStack_3e0 = (RpcConnectionState *)0x0;
      local_3f8._0_8_ = (RpcConnectionState *)0x0;
    }
    local_198._24_4_ = local_3d0._0_4_;
    local_198._0_8_ = local_3f8._0_8_;
    local_198._8_8_ = local_3f8._8_8_;
    local_198._16_8_ = pRStack_3e0;
    PointerReader::getStruct((StructReader *)local_308,(PointerReader *)local_198,(word *)0x0);
    if ((0x2f < (uint)local_2e8[0]._0_4_) && (*(short *)(local_308._16_8_ + 4) != 0)) {
      return;
    }
    pRStack_448 = (RpcConnectionState *)local_308._8_8_;
    local_440 = (RpcConnectionState *)_iStack_2f0;
    local_450 = (undefined1  [8])local_308._0_8_;
    if (local_2e8[0]._4_2_ == 0) {
      local_2e8[0]._8_4_ = 0x7fffffff;
      pRStack_448 = (RpcConnectionState *)0x0;
      local_440 = (RpcConnectionState *)0x0;
      local_450 = (undefined1  [8])(RpcConnectionState *)0x0;
    }
    local_438 = (RpcConnectionState *)CONCAT44(local_438._4_4_,local_2e8[0]._8_4_);
    sVar38 = 0;
    PointerReader::getStruct((StructReader *)local_198,(PointerReader *)local_450,(word *)0x0);
    if (0xf < (uint)local_198._32_4_) {
      sVar38 = *(short *)local_198._16_8_;
    }
    if (sVar38 == 5) {
      id = 0;
      local_378._8_8_ = local_198._8_8_;
      local_378._16_8_ = local_198._24_8_;
      local_378._0_8_ = local_198._0_8_;
      if (local_198._36_2_ == 0) {
        local_198._40_4_ = 0x7fffffff;
        local_378._8_8_ = (RpcConnectionState *)0x0;
        local_378._16_8_ = (RpcConnectionState *)0x0;
        local_378._0_8_ = (RpcConnectionState *)0x0;
      }
      local_378._24_4_ = local_198._40_4_;
      PointerReader::getStruct((StructReader *)local_450,(PointerReader *)local_378,(word *)0x0);
      if (0x1f < (uint)local_430) {
        id = *(ExportId *)&(local_440->super_ErrorHandler)._vptr_ErrorHandler;
      }
    }
    else {
      if ((sVar38 != 2) && (sVar38 != 1)) {
        return;
      }
      id = 0;
      if (0x3f < (uint)local_198._32_4_) {
        id = *(ExportId *)(local_198._16_8_ + 4);
      }
    }
    refcount = 1;
    goto LAB_003c24b9;
  case 1:
    if (local_3b8._36_2_ == 0) {
      local_3b8._40_4_ = 0x7fffffff;
      local_3b8._8_8_ = (RpcConnectionState *)0x0;
      local_3b8._24_8_ = (RpcConnectionState *)0x0;
      local_3b8._0_8_ = (RpcConnectionState *)0x0;
    }
    iStack_2f0 = local_3b8._40_4_;
    local_308._0_8_ = local_3b8._0_8_;
    local_308._8_8_ = local_3b8._8_8_;
    local_308._16_8_ = local_3b8._24_8_;
    PointerReader::getStruct((StructReader *)local_198,(PointerReader *)local_308,(word *)0x0);
    toException((Exception *)local_308,(Reader *)local_198);
    kj::throwRecoverableException((Exception *)local_308,0);
    kj::Exception::~Exception((Exception *)local_308);
    break;
  case 2:
    if (local_3b8._36_2_ == 0) {
      local_3b8._8_8_ = (RpcConnectionState *)0x0;
      local_3b8._24_8_ = (RpcConnectionState *)0x0;
      local_3b8._0_8_ = (RpcConnectionState *)0x0;
      local_3b8._40_4_ = 0x7fffffff;
    }
    iStack_2f0 = local_3b8._40_4_;
    local_308._0_8_ = local_3b8._0_8_;
    local_308._8_8_ = local_3b8._8_8_;
    local_308._16_8_ = local_3b8._24_8_;
    PointerReader::getStruct((StructReader *)local_450,(PointerReader *)local_308,(word *)0x0);
    local_418.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    local_418.size_ = 0;
    local_198._16_8_ = (RpcConnectionState *)0x0;
    local_198._0_8_ = (RpcConnectionState *)0x0;
    local_198._8_8_ = (RpcConnectionState *)0x0;
    iVar39 = 0x7fffffff;
    if (local_430._4_2_ != 0) {
      local_198._16_8_ = local_438;
      local_198._0_8_ = local_450;
      local_198._8_8_ = pRStack_448;
      iVar39 = (int)local_428;
    }
    local_198._24_4_ = iVar39;
    PointerReader::getStruct((StructReader *)local_308,(PointerReader *)local_198,(word *)0x0);
    getMessageTarget((RpcConnectionState *)local_3f8,(Reader *)this);
    uVar18 = local_3f8._8_8_;
    uVar46 = local_3f8._0_8_;
    sVar8 = local_418.size_;
    pMVar19 = local_418.ptr;
    pRVar33 = (RpcConnectionState *)local_3f8._8_8_;
    if ((RpcConnectionState *)local_3f8._8_8_ != (RpcConnectionState *)0x0) {
      local_418.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)local_3f8._0_8_;
      local_418.size_ = local_3f8._8_8_;
      if ((RpcConnectionState *)sVar8 != (RpcConnectionState *)0x0) {
        (*(code *)((SegmentReader *)((ErrorHandler *)&pMVar19->ptr)->_vptr_ErrorHandler)->arena)();
      }
      pRVar33 = (RpcConnectionState *)0x0;
    }
    if (pRVar33 != (RpcConnectionState *)0x0) {
      (**(code **)*(_func_int **)uVar46)
                (uVar46,(long)&(pRVar33->super_ErrorHandler)._vptr_ErrorHandler +
                        ((SegmentReader *)(pRVar33->super_ErrorHandler)._vptr_ErrorHandler)[-1].ptr.
                        size_);
    }
    if ((RpcConnectionState *)uVar18 != (RpcConnectionState *)0x0) {
      if ((uint)local_430 < 0x40) {
        sVar38 = 0;
      }
      else {
        sVar38 = *(short *)((long)&(local_440->super_ErrorHandler)._vptr_ErrorHandler + 6);
      }
      if (sVar38 == 0) {
        local_3d0._16_8_ = (ulong)(uint)local_3d0._20_4_ << 0x20;
      }
      else {
        if (sVar38 != 1) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                    ((Fault *)local_308,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x902,FAILED,(char *)0x0,"\"Unsupported `Call.sendResultsTo`.\"",
                     (char (*) [34])"Unsupported `Call.sendResultsTo`.");
          kj::_::Debug::Fault::~Fault((Fault *)local_308);
          goto LAB_003c22ce;
        }
        local_3d0._16_4_ = 1;
      }
      if (local_430._4_2_ < 2) {
        iVar39 = 0x7fffffff;
        local_198._8_8_ = (RpcConnectionState *)0x0;
        local_198._16_8_ = (RpcConnectionState *)0x0;
        local_198._0_8_ = (RpcConnectionState *)0x0;
      }
      else {
        local_198._16_8_ = &local_438->super_Refcounted;
        local_198._8_8_ = pRStack_448;
        local_198._0_8_ = local_450;
        iVar39 = (int)local_428;
      }
      local_198._24_4_ = iVar39;
      PointerReader::getStruct((StructReader *)local_308,(PointerReader *)local_198,(word *)0x0);
      if ((ushort)local_2e8[0]._4_2_ < 2) {
        uVar40 = 0x7fffffff;
        local_3f8._8_8_ = (RpcConnectionState *)0x0;
        local_3e8 = (WirePointer *)0x0;
        local_3f8._0_8_ = (RpcConnectionState *)0x0;
      }
      else {
        local_3e8 = (WirePointer *)(_iStack_2f0 + 8);
        local_3f8._8_8_ = local_308._8_8_;
        local_3f8._0_8_ = local_308._0_8_;
        uVar40 = local_2e8[0]._8_4_;
      }
      pRStack_3e0 = (RpcConnectionState *)CONCAT44(pRStack_3e0._4_4_,uVar40);
      PointerReader::getList
                ((ListReader *)local_198,(PointerReader *)local_3f8,INLINE_COMPOSITE,(word *)0x0);
      capTable.reader.capTable = (CapTableReader *)local_198._8_8_;
      capTable.reader.segment = (SegmentReader *)local_198._0_8_;
      capTable.reader.ptr = (byte *)local_198._16_8_;
      capTable.reader.elementCount = local_198._24_4_;
      capTable.reader.step = local_198._28_4_;
      capTable.reader.structDataSize = local_198._32_4_;
      capTable.reader.structPointerCount = local_198._36_2_;
      capTable.reader.elementSize = local_198[0x26];
      capTable.reader._39_1_ = local_198[0x27];
      capTable.reader._40_8_ = local_198._40_8_;
      receiveCaps((Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)(local_378 + 0x30),this,capTable
                 );
      kj::newPromiseAndFulfiller<void>();
      uVar23 = 0;
      if (0x1f < (uint)local_430) {
        uVar23 = *(uint *)&(local_440->super_ErrorHandler)._vptr_ErrorHandler;
      }
      if (local_2e8[0]._4_2_ == 0) {
        local_328._12_4_ = 0x7fffffff;
        local_1a0 = (undefined1  [8])0x0;
        local_1a8 = (RpcConnectionState *)0x0;
        pRVar33 = (RpcConnectionState *)0x0;
      }
      else {
        local_1a0 = (undefined1  [8])local_308._8_8_;
        local_1a8 = (RpcConnectionState *)_iStack_2f0;
        local_328._12_4_ = local_2e8[0]._8_4_;
        pRVar33 = (RpcConnectionState *)local_308._0_8_;
      }
      if ((uint)local_430 < 0x80) {
        pCVar37 = (CapTableReader *)0x0;
      }
      else {
        pCVar37 = (CapTableReader *)(local_440->super_Refcounted).super_Disposer._vptr_Disposer;
      }
      if ((uint)local_430 < 0x30) {
        uVar53 = 0;
      }
      else {
        uVar53 = *(uint16_t *)((long)&(local_440->super_ErrorHandler)._vptr_ErrorHandler + 4);
      }
      pRVar28 = (RpcCallContext *)operator_new(0x108);
      local_488.disposer = (Disposer *)local_378._48_8_;
      local_478 = (RpcConnectionState *)CONCAT71(local_378._65_7_,local_378[0x40]);
      local_488.ptr = (PromiseNode *)local_378._56_8_;
      local_378._48_8_ = (RpcConnectionState *)0x0;
      local_378._56_8_ = (RpcConnectionState *)0x0;
      local_458 = (Own<kj::_::PromiseNode> *)&pRVar28->super_Refcounted;
      (pRVar28->super_Refcounted).refcount = 0;
      (pRVar28->super_CallContextHook)._vptr_CallContextHook = (_func_int **)&PTR_getParams_00644e50
      ;
      (pRVar28->super_Refcounted).super_Disposer._vptr_Disposer =
           (_func_int **)&PTR_disposeImpl_00644eb0;
      puVar1 = &(this->super_Refcounted).refcount;
      *puVar1 = *puVar1 + 1;
      (pRVar28->connectionState).disposer = &(this->super_Refcounted).super_Disposer;
      (pRVar28->connectionState).ptr = this;
      pRVar28->answerId = uVar23;
      pRVar28->interfaceId = (uint64_t)pCVar37;
      pRVar28->methodId = uVar53;
      (**message->ptr->_vptr_IncomingRpcMessage)(local_3f8);
      MVar56 = PointerReader::targetSize((PointerReader *)local_3f8);
      pRVar28->requestSize = MVar56.wordCount;
      (pRVar28->request).ptr.disposer = message->disposer;
      (pRVar28->request).ptr.ptr = message->ptr;
      message->ptr = (IncomingRpcMessage *)0x0;
      local_4a8._0_8_ = local_488.disposer;
      local_4a8._8_8_ = local_488.ptr;
      local_498 = local_478;
      local_488.disposer = (Disposer *)0x0;
      local_488.ptr = (PromiseNode *)0x0;
      ReaderCapabilityTable::ReaderCapabilityTable
                (&pRVar28->paramsCapTable,
                 (Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)local_4a8);
      uVar18 = local_4a8._8_8_;
      uVar46 = local_4a8._0_8_;
      if ((RpcConnectionState *)local_4a8._0_8_ != (RpcConnectionState *)0x0) {
        local_4a8._0_8_ = (RpcConnectionState *)0x0;
        local_4a8._8_8_ = (RpcConnectionState *)0x0;
        (*(code *)((SegmentReader *)(local_498->super_ErrorHandler)._vptr_ErrorHandler)->arena)
                  (local_498,uVar46,0x10,uVar18,uVar18,
                   kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>::
                   destruct);
      }
      local_3f8._8_8_ = local_1a0;
      local_3e8 = (WirePointer *)local_1a8;
      pRStack_3e0 = (RpcConnectionState *)CONCAT44(pRStack_3e0._4_4_,local_328._12_4_);
      local_3f8._0_8_ = pRVar33;
      PointerReader::imbue
                (&(pRVar28->params).reader,(PointerReader *)local_3f8,
                 &(pRVar28->paramsCapTable).super_CapTableReader);
      (pRVar28->returnMessage)._builder.data = (void *)0x0;
      (pRVar28->returnMessage)._builder.pointers = (WirePointer *)0x0;
      (pRVar28->returnMessage)._builder.segment = (SegmentBuilder *)0x0;
      (pRVar28->returnMessage)._builder.capTable = (CapTableBuilder *)0x0;
      (pRVar28->response).ptr.disposer = (Disposer *)0x0;
      (pRVar28->response).ptr.ptr = (RpcServerResponse *)0x0;
      bVar42 = SUB81(local_3d0._16_8_,0);
      pRVar28->redirectResults = bVar42;
      pRVar28->responseSent = false;
      (pRVar28->tailCallPipelineFulfiller).ptr.disposer = (Disposer *)0x0;
      (pRVar28->tailCallPipelineFulfiller).ptr.ptr =
           (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0;
      pRVar28->cancellationFlags = '\0';
      (pRVar28->cancelFulfiller).disposer = (Disposer *)local_378._16_8_;
      (pRVar28->cancelFulfiller).ptr = (PromiseFulfiller<void> *)local_378._24_8_;
      local_378._24_8_ = (RpcConnectionState *)0x0;
      kj::UnwindDetector::UnwindDetector(&pRVar28->unwindDetector);
      pPVar6 = local_488.ptr;
      pDVar55 = local_488.disposer;
      this->callWordsInFlight = this->callWordsInFlight + pRVar28->requestSize;
      puVar1 = &(pRVar28->super_Refcounted).refcount;
      *puVar1 = *puVar1 + 1;
      if ((RpcConnectionState *)local_488.disposer != (RpcConnectionState *)0x0) {
        local_488.disposer = (Disposer *)0x0;
        local_488.ptr = (PromiseNode *)0x0;
        (*(code *)((SegmentReader *)(local_478->super_ErrorHandler)._vptr_ErrorHandler)->arena)
                  (local_478,pDVar55,0x10,pPVar6,pPVar6,
                   kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>::
                   destruct);
      }
      local_3f8._0_4_ = uVar23;
      if (uVar23 < 0x10) {
        pmVar25 = (mapped_type *)&(this->answers).low[uVar23].active;
      }
      else {
        pmVar25 = std::
                  unordered_map<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>_>_>
                  ::operator[](&(this->answers).high,(key_type *)local_3f8);
      }
      pOVar41 = local_458;
      if (pmVar25->active == false) {
        pmVar25->active = true;
        (pmVar25->callContext).ptr = pRVar28;
        if ((uint)local_430 < 0x80) {
          pCVar37 = (CapTableReader *)0x0;
        }
        else {
          pCVar37 = (CapTableReader *)(local_440->super_Refcounted).super_Disposer._vptr_Disposer;
        }
        if ((uint)local_430 < 0x30) {
          methodId = 0;
        }
        else {
          methodId = (uint64_t)
                     *(ushort *)((long)&(local_440->super_ErrorHandler)._vptr_ErrorHandler + 4);
        }
        puVar1 = &(pRVar28->super_Refcounted).refcount;
        *puVar1 = *puVar1 + 1;
        local_4a8._0_8_ = local_458;
        local_4a8._8_8_ = pRVar28;
        startCall((VoidPromiseAndPipeline *)local_3f8,this,(uint64_t)pCVar37,methodId,
                  (Own<capnp::ClientHook> *)&local_418,(Own<capnp::CallContextHook> *)local_4a8);
        uVar46 = local_4a8._8_8_;
        if ((RpcCallContext *)local_4a8._8_8_ != (RpcCallContext *)0x0) {
          local_4a8._8_8_ = (RpcCallContext *)0x0;
          (**(code **)*(_func_int **)local_4a8._0_8_)
                    (local_4a8._0_8_,uVar46 + *(long *)(*(_func_int **)uVar46 + -0x10));
        }
        local_4a8._0_4_ = uVar23;
        if (uVar23 < 0x10) {
          pmVar25 = (mapped_type *)&(this->answers).low[uVar23].active;
        }
        else {
          pmVar25 = std::
                    unordered_map<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>_>_>
                    ::operator[](&(this->answers).high,(key_type *)local_4a8);
        }
        SVar20 = (StructDataBitCount)pRStack_3e0;
        uVar40 = pRStack_3e0._4_4_;
        pRStack_3e0 = (RpcConnectionState *)0x0;
        pDVar55 = (pmVar25->pipeline).ptr.disposer;
        pPVar54 = (pmVar25->pipeline).ptr.ptr;
        *(uint *)&(pmVar25->pipeline).ptr.disposer = (uint)local_3e8;
        *(undefined4 *)((long)&(pmVar25->pipeline).ptr.disposer + 4) = local_3e8._4_4_;
        *(StructDataBitCount *)&(pmVar25->pipeline).ptr.ptr = SVar20;
        *(undefined4 *)((long)&(pmVar25->pipeline).ptr.ptr + 4) = uVar40;
        if (pPVar54 != (PipelineHook *)0x0) {
          (**pDVar55->_vptr_Disposer)
                    (pDVar55,(_func_int *)
                             ((long)&pPVar54->_vptr_PipelineHook +
                             (long)pPVar54->_vptr_PipelineHook[-2]));
        }
        if (bVar42 == false) {
          pTVar31 = (TransformPromiseNodeBase *)operator_new(0x30);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar31,(Own<kj::_::PromiseNode> *)local_3f8,
                     kj::_::
                     TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2366:13),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2368:16)>
                     ::anon_class_8_1_adc9bc7d_for_func::operator());
          (pTVar31->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00645578;
          pTVar31[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pRVar28;
          pTVar31[1].dependency.disposer = (Disposer *)pRVar28;
          local_378._72_8_ =
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#2}>>
                ::instance;
          local_328._0_8_ = pTVar31;
          pTVar31 = (TransformPromiseNodeBase *)operator_new(0x30);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar31,(Own<kj::_::PromiseNode> *)(local_378 + 0x48),
                     kj::_::IdentityFunc<void>::operator());
          (pTVar31->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00645698;
          pTVar31[1].dependency.disposer = (Disposer *)this;
          local_388.disposer =
               (Disposer *)
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#3}>>
                ::instance;
          local_388.ptr = (PromiseNode *)pTVar31;
          pAVar34 = (AttachmentPromiseNodeBase *)operator_new(0x28);
          kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(pAVar34,&local_388);
          (pAVar34->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00645720;
          pAVar34[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pOVar41;
          pAVar34[1].dependency.disposer = (Disposer *)pRVar28;
          local_468.disposer =
               (Disposer *)
               &kj::_::
                HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>>>
                ::instance;
          local_468.ptr = (PromiseNode *)pAVar34;
          kj::
          heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
                    ((kj *)local_4a8,&local_468,(Own<kj::_::PromiseNode> *)local_378);
          local_488.disposer = (Disposer *)local_4a8._0_8_;
          local_488.ptr = (PromiseNode *)local_4a8._8_8_;
          pRVar33 = (RpcConnectionState *)operator_new(0x28);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    ((TransformPromiseNodeBase *)pRVar33,&local_488,
                     kj::_::
                     TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/../kj/async-inl.h:992:25),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2375:21)>
                     ::anon_class_1_0_00000001_for_func::operator());
          (pRVar33->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&PTR_onReady_006457a0;
          local_4a8._0_8_ =
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::Promise<void>::detach<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}>(capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}&&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#4}>>
                ::instance;
          local_4a8._8_8_ = pRVar33;
          kj::_::detach((Promise<void> *)local_4a8);
          uVar46 = local_4a8._8_8_;
          if ((RpcConnectionState *)local_4a8._8_8_ != (RpcConnectionState *)0x0) {
            local_4a8._8_8_ = (RpcConnectionState *)0x0;
            (**(code **)*(_func_int **)local_4a8._0_8_)
                      (local_4a8._0_8_,uVar46 + *(long *)(*(_func_int **)uVar46 + -0x10));
          }
          pPVar6 = local_488.ptr;
          if ((RpcCallContext *)local_488.ptr != (RpcCallContext *)0x0) {
            local_488.ptr = (PromiseNode *)0x0;
            (**((ErrorHandler *)&(local_488.disposer)->_vptr_Disposer)->_vptr_ErrorHandler)
                      (local_488.disposer,
                       (_func_int *)
                       ((long)&((CallContextHook *)&pPVar6->_vptr_PromiseNode)->
                               _vptr_CallContextHook +
                       (long)((CallContextHook *)&pPVar6->_vptr_PromiseNode)->_vptr_CallContextHook
                             [-2]));
          }
          pPVar6 = local_468.ptr;
          if ((AttachmentPromiseNodeBase *)local_468.ptr != (AttachmentPromiseNodeBase *)0x0) {
            local_468.ptr = (PromiseNode *)0x0;
            (**((Disposer *)&(local_468.disposer)->_vptr_Disposer)->_vptr_Disposer)
                      (local_468.disposer,
                       (_func_int *)
                       ((long)&((PromiseNode *)&pPVar6->_vptr_PromiseNode)->_vptr_PromiseNode +
                       (long)((PromiseNode *)&pPVar6->_vptr_PromiseNode)->_vptr_PromiseNode[-2]));
          }
          pPVar6 = local_388.ptr;
          if ((TransformPromiseNodeBase *)local_388.ptr != (TransformPromiseNodeBase *)0x0) {
            local_388.ptr = (PromiseNode *)0x0;
            (**(local_388.disposer)->_vptr_Disposer)
                      (local_388.disposer,(long)pPVar6 + *(long *)(*(long *)pPVar6 + -0x10));
          }
          uVar46 = local_328._0_8_;
          if ((TransformPromiseNodeBase *)local_328._0_8_ != (TransformPromiseNodeBase *)0x0) {
            local_328._0_8_ = (TransformPromiseNodeBase *)0x0;
            (*(code *)**(undefined8 **)local_378._72_8_)
                      (local_378._72_8_,uVar46 + *(long *)(*(long *)uVar46 + -0x10));
          }
        }
        else {
          this_00 = (RpcCallContext *)operator_new(0x40);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    ((TransformPromiseNodeBase *)this_00,(Own<kj::_::PromiseNode> *)local_3f8,
                     kj::
                     CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2346:36),_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>_>
                     ::operator()<>);
          (this_00->super_CallContextHook)._vptr_CallContextHook =
               (_func_int **)&PTR_onReady_006452f0;
          *(Own<kj::_::PromiseNode> **)&this_00->answerId = pOVar41;
          this_00->interfaceId = (uint64_t)pRVar28;
          local_488.disposer =
               (Disposer *)
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>&&)#1},kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcCallContext>>,kj::_::PropagateException>>
                ::instance;
          local_488.ptr = (PromiseNode *)this_00;
          kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>::
          fork((Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                *)&local_468);
          PVar59 = kj::
                   ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                   ::addBranch((ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                                *)local_4a8);
          if ((pmVar25->redirectedResults).ptr.isSet == true) {
            (pmVar25->redirectedResults).ptr.isSet = false;
            pPVar6 = (pmVar25->redirectedResults).ptr.field_1.value.super_PromiseBase.node.ptr;
            if (pPVar6 != (PromiseNode *)0x0) {
              (pmVar25->redirectedResults).ptr.field_1.value.super_PromiseBase.node.ptr =
                   (PromiseNode *)0x0;
              pDVar55 = (pmVar25->redirectedResults).ptr.field_1.value.super_PromiseBase.node.
                        disposer;
              (**pDVar55->_vptr_Disposer)
                        (pDVar55,(_func_int *)
                                 ((long)&pPVar6->_vptr_PromiseNode +
                                 (long)pPVar6->_vptr_PromiseNode[-2]),
                         PVar59.super_PromiseBase.node.ptr);
            }
          }
          (pmVar25->redirectedResults).ptr.field_1.value.super_PromiseBase.node.disposer =
               (Disposer *)local_4a8._0_8_;
          (pmVar25->redirectedResults).ptr.field_1.value.super_PromiseBase.node.ptr =
               (PromiseNode *)local_4a8._8_8_;
          local_4a8._8_8_ = (TransformPromiseNodeBase *)0x0;
          (pmVar25->redirectedResults).ptr.isSet = true;
          kj::
          ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
          ::addBranch((ForkedPromise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>
                       *)(local_328 + 0x10));
          pTVar31 = (TransformPromiseNodeBase *)operator_new(0x28);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar31,(Own<kj::_::PromiseNode> *)(local_328 + 0x10),
                     kj::_::
                     TransformPromiseNode<kj::_::Void,_kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2358:52),_kj::_::PropagateException>
                     ::anon_class_1_0_00000001_for_func::operator());
          (pTVar31->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00645468;
          local_378._72_8_ =
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>,capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>&&)#1},kj::_::PropagateException>>
                ::instance;
          local_328._0_8_ = pTVar31;
          kj::
          heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
                    ((kj *)local_4a8,(Own<kj::_::PromiseNode> *)local_378,
                     (Own<kj::_::PromiseNode> *)(local_378 + 0x48));
          local_388.disposer = (Disposer *)local_4a8._0_8_;
          local_388.ptr = (PromiseNode *)local_4a8._8_8_;
          pRVar33 = (RpcConnectionState *)operator_new(0x28);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    ((TransformPromiseNodeBase *)pRVar33,&local_388,
                     kj::_::
                     TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/../kj/async-inl.h:992:25),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2359:21)>
                     ::anon_class_1_0_00000001_for_func::operator());
          (pRVar33->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&PTR_onReady_006454f0;
          local_4a8._0_8_ =
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::Promise<void>::detach<capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}>(capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}&&)::{lambda()#1},capnp::_::(anonymous_namespace)::RpcConnectionState::handleCall(kj::Own<capnp::IncomingRpcMessage>&&,capnp::rpc::Call::Reader_const&)::{lambda(kj::Exception&&)#1}>>
                ::instance;
          local_4a8._8_8_ = pRVar33;
          kj::_::detach((Promise<void> *)local_4a8);
          uVar46 = local_4a8._8_8_;
          if ((RpcConnectionState *)local_4a8._8_8_ != (RpcConnectionState *)0x0) {
            local_4a8._8_8_ = (RpcConnectionState *)0x0;
            (**(code **)*(_func_int **)local_4a8._0_8_)
                      (local_4a8._0_8_,uVar46 + *(long *)(*(_func_int **)uVar46 + -0x10));
          }
          pPVar6 = local_388.ptr;
          if ((TransformPromiseNodeBase *)local_388.ptr != (TransformPromiseNodeBase *)0x0) {
            local_388.ptr = (PromiseNode *)0x0;
            (**(local_388.disposer)->_vptr_Disposer)
                      (local_388.disposer,(long)pPVar6 + *(long *)(*(long *)pPVar6 + -0x10));
          }
          uVar46 = local_328._0_8_;
          if ((TransformPromiseNodeBase *)local_328._0_8_ != (TransformPromiseNodeBase *)0x0) {
            local_328._0_8_ = (TransformPromiseNodeBase *)0x0;
            (*(code *)**(undefined8 **)local_378._72_8_)
                      (local_378._72_8_,uVar46 + *(long *)(*(long *)uVar46 + -0x10));
          }
          uVar46 = local_328._24_8_;
          if ((long *)local_328._24_8_ != (long *)0x0) {
            local_328._24_8_ = (long *)0x0;
            (*(code *)**(undefined8 **)local_328._16_8_)
                      (local_328._16_8_,uVar46 + *(long *)(*(long *)uVar46 + -0x10));
          }
          pPVar6 = local_468.ptr;
          if ((AttachmentPromiseNodeBase *)local_468.ptr != (AttachmentPromiseNodeBase *)0x0) {
            local_468.ptr = (PromiseNode *)0x0;
            (**((Disposer *)&(local_468.disposer)->_vptr_Disposer)->_vptr_Disposer)
                      (local_468.disposer,
                       (_func_int *)
                       ((long)&((PromiseNode *)&pPVar6->_vptr_PromiseNode)->_vptr_PromiseNode +
                       (long)((PromiseNode *)&pPVar6->_vptr_PromiseNode)->_vptr_PromiseNode[-2]));
          }
          pPVar6 = local_488.ptr;
          if ((RpcCallContext *)local_488.ptr != (RpcCallContext *)0x0) {
            local_488.ptr = (PromiseNode *)0x0;
            (**((ErrorHandler *)&(local_488.disposer)->_vptr_Disposer)->_vptr_ErrorHandler)
                      (local_488.disposer,
                       (_func_int *)
                       ((long)&((CallContextHook *)&pPVar6->_vptr_PromiseNode)->
                               _vptr_CallContextHook +
                       (long)((CallContextHook *)&pPVar6->_vptr_PromiseNode)->_vptr_CallContextHook
                             [-2]));
          }
        }
        pRVar33 = pRStack_3e0;
        if (pRStack_3e0 != (RpcConnectionState *)0x0) {
          pRStack_3e0 = (RpcConnectionState *)0x0;
          (*(code *)((SegmentReader *)
                    ((ErrorHandler *)&local_3e8->offsetAndKind)->_vptr_ErrorHandler)->arena)
                    (local_3e8,
                     (long)&(pRVar33->super_ErrorHandler)._vptr_ErrorHandler +
                     ((SegmentReader *)(pRVar33->super_ErrorHandler)._vptr_ErrorHandler)[-1].ptr.
                     size_);
        }
        uVar46 = local_3f8._8_8_;
        if ((RpcConnectionState *)local_3f8._8_8_ != (RpcConnectionState *)0x0) {
          local_3f8._8_8_ = (RpcConnectionState *)0x0;
          (**(code **)*(_func_int **)local_3f8._0_8_)
                    (local_3f8._0_8_,uVar46 + *(long *)(*(_func_int **)uVar46 + -0x10));
        }
        pRVar28 = (RpcCallContext *)0x0;
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29]>
                  ((Fault *)local_3f8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x915,FAILED,"!answer.active","\"questionId is already in use\"",
                   (char (*) [29])"questionId is already in use");
        kj::_::Debug::Fault::~Fault((Fault *)local_3f8);
        pOVar41 = local_458;
      }
      if (pRVar28 != (RpcCallContext *)0x0) {
        (**((Disposer *)&pOVar41->disposer)->_vptr_Disposer)
                  (pOVar41,(_func_int *)
                           ((long)&(pRVar28->super_CallContextHook)._vptr_CallContextHook +
                           (long)(pRVar28->super_CallContextHook)._vptr_CallContextHook[-2]));
      }
      uVar46 = local_378._24_8_;
      if ((RpcConnectionState *)local_378._24_8_ != (RpcConnectionState *)0x0) {
        local_378._24_8_ = (RpcConnectionState *)0x0;
        (*(code *)**(undefined8 **)local_378._16_8_)
                  (local_378._16_8_,uVar46 + *(long *)(*(long *)uVar46 + -0x10));
      }
      uVar46 = local_378._8_8_;
      if ((RpcConnectionState *)local_378._8_8_ != (RpcConnectionState *)0x0) {
        local_378._8_8_ = (RpcConnectionState *)0x0;
        (*(code *)**(undefined8 **)local_378._0_8_)
                  (local_378._0_8_,uVar46 + *(long *)(*(long *)uVar46 + -0x10));
      }
      uVar18 = local_378._56_8_;
      uVar46 = local_378._48_8_;
      if ((RpcConnectionState *)local_378._48_8_ != (RpcConnectionState *)0x0) {
        local_378._48_8_ = (RpcConnectionState *)0x0;
        local_378._56_8_ = (RpcConnectionState *)0x0;
        (*(code *)**(undefined8 **)CONCAT71(local_378._65_7_,local_378[0x40]))
                  ((undefined8 *)CONCAT71(local_378._65_7_,local_378[0x40]),uVar46,0x10,uVar18,
                   uVar18,kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>
                          ::destruct);
      }
    }
LAB_003c22ce:
    pRVar45 = (RpcConnectionState *)local_418.size_;
    if ((RpcConnectionState *)local_418.size_ == (RpcConnectionState *)0x0) {
      return;
    }
    local_418.size_ = 0;
    pRVar33 = (RpcConnectionState *)local_418.ptr;
    goto LAB_003c22f3;
  case 3:
    if (local_3b8._36_2_ == 0) {
      local_3b8._40_4_ = 0x7fffffff;
      local_3b8._8_8_ = (RpcConnectionState *)0x0;
      local_3b8._24_8_ = (RpcConnectionState *)0x0;
      local_3b8._0_8_ = (RpcConnectionState *)0x0;
    }
    iStack_2f0 = local_3b8._40_4_;
    uVar36 = 0;
    this_01 = (QuestionRef *)local_450;
    local_308._0_8_ = local_3b8._0_8_;
    local_308._8_8_ = local_3b8._8_8_;
    local_308._16_8_ = local_3b8._24_8_;
    PointerReader::getStruct((StructReader *)this_01,(PointerReader *)local_308,(word *)0x0);
    local_378._56_8_ = &local_488;
    local_488.disposer = (Disposer *)0x0;
    local_488.ptr = (PromiseNode *)0x0;
    local_478 = (RpcConnectionState *)0x0;
    local_378[0x40] = '\0';
    if (0x1f < (uint)local_430) {
      uVar36 = (ulong)*(uint *)&(local_440->super_ErrorHandler)._vptr_ErrorHandler;
    }
    entry = (this->questions).slots.builder.ptr;
    uVar47 = ((long)(this->questions).slots.builder.pos - (long)entry >> 3) * -0x3333333333333333;
    if ((uVar47 < uVar36 || uVar47 - uVar36 == 0) ||
       ((pQVar49 = entry + uVar36, pQVar49->isAwaitingReturn == false &&
        (entry[uVar36].selfRef.ptr == (QuestionRef *)0x0)))) {
      pQVar49 = (Question *)0x0;
    }
    local_378._48_8_ = this;
    if (pQVar49 == (Question *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
                ((Fault *)local_308,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xa05,FAILED,(char *)0x0,"\"Invalid question ID in Return message.\"",
                 (char (*) [39])"Invalid question ID in Return message.");
      kj::_::Debug::Fault::~Fault((Fault *)local_308);
LAB_003c07e4:
      bVar42 = false;
    }
    else {
      if (pQVar49->isAwaitingReturn == false) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
                  ((Fault *)local_308,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x9b5,FAILED,"question->isAwaitingReturn","\"Duplicate Return.\"",
                   (char (*) [18])"Duplicate Return.");
        kj::_::Debug::Fault::~Fault((Fault *)local_308);
        goto LAB_003c07e4;
      }
      pQVar49->isAwaitingReturn = false;
      if (((uint)local_430 < 0x21) ||
         (((ulong)(local_440->super_ErrorHandler)._vptr_ErrorHandler & 0x100000000) == 0)) {
        local_378[0x40] = '\0';
        local_488.disposer = (Disposer *)(pQVar49->paramExports).ptr;
        local_488.ptr = (PromiseNode *)(pQVar49->paramExports).size_;
        local_478 = (RpcConnectionState *)(pQVar49->paramExports).disposer;
        (pQVar49->paramExports).ptr = (uint *)0x0;
        (pQVar49->paramExports).size_ = 0;
      }
      else {
        puVar7 = (pQVar49->paramExports).ptr;
        if (puVar7 != (uint *)0x0) {
          entry = (Question *)(pQVar49->paramExports).size_;
          pAVar9 = (pQVar49->paramExports).disposer;
          (pQVar49->paramExports).ptr = (uint *)0x0;
          (pQVar49->paramExports).size_ = 0;
          (**pAVar9->_vptr_ArrayDisposer)(pAVar9,puVar7,4,entry,entry,0);
        }
      }
      this_01 = (pQVar49->selfRef).ptr;
      if (this_01 != (QuestionRef *)0x0) {
        if ((uint)local_430 < 0x40) {
          uVar22 = 0;
        }
        else {
          uVar22 = *(undefined2 *)((long)&(local_440->super_ErrorHandler)._vptr_ErrorHandler + 6);
        }
        switch(uVar22) {
        case 0:
          if (pQVar49->isTailCall == true) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[67]>
                      ((Fault *)local_308,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x9c2,FAILED,"!question->isTailCall",
                       "\"Tail call `Return` must set `resultsSentElsewhere`, not `results`.\"",
                       (char (*) [67])
                       "Tail call `Return` must set `resultsSentElsewhere`, not `results`.");
            kj::_::Debug::Fault::~Fault((Fault *)local_308);
          }
          else {
            if (local_430._4_2_ == 0) {
              local_428._0_4_ = 0x7fffffff;
              pRStack_448 = (RpcConnectionState *)0x0;
              local_438 = (RpcConnectionState *)0x0;
              local_450 = (undefined1  [8])0x0;
            }
            local_198._24_4_ = (int)local_428;
            local_198._0_8_ = local_450;
            local_198._8_8_ = pRStack_448;
            local_198._16_8_ = local_438;
            PointerReader::getStruct
                      ((StructReader *)local_308,(PointerReader *)local_198,(word *)0x0);
            if ((ushort)local_2e8[0]._4_2_ < 2) {
              uVar40 = 0x7fffffff;
              local_3f8._8_8_ = (RpcConnectionState *)0x0;
              local_3e8 = (WirePointer *)0x0;
              local_3f8._0_8_ = (RpcConnectionState *)0x0;
            }
            else {
              local_3e8 = (WirePointer *)(_iStack_2f0 + 8);
              local_3f8._8_8_ = local_308._8_8_;
              local_3f8._0_8_ = local_308._0_8_;
              uVar40 = local_2e8[0]._8_4_;
            }
            pRStack_3e0 = (RpcConnectionState *)CONCAT44(pRStack_3e0._4_4_,uVar40);
            PointerReader::getList
                      ((ListReader *)local_198,(PointerReader *)local_3f8,INLINE_COMPOSITE,
                       (word *)0x0);
            capTable_00.reader.capTable = (CapTableReader *)local_198._8_8_;
            capTable_00.reader.segment = (SegmentReader *)local_198._0_8_;
            capTable_00.reader.ptr = (byte *)local_198._16_8_;
            capTable_00.reader.elementCount = local_198._24_4_;
            capTable_00.reader.step = local_198._28_4_;
            capTable_00.reader.structDataSize = local_198._32_4_;
            capTable_00.reader.structPointerCount = local_198._36_2_;
            capTable_00.reader.elementSize = local_198[0x26];
            capTable_00.reader._39_1_ = local_198[0x27];
            capTable_00.reader._40_8_ = local_198._40_8_;
            receiveCaps(&local_418,this,capTable_00);
            puVar1 = &(this_01->super_Refcounted).refcount;
            *puVar1 = *puVar1 + 1;
            if (local_2e8[0]._4_2_ == 0) {
              uVar40 = 0x7fffffff;
              local_3d0._16_8_ = (RpcConnectionState *)0x0;
              uVar46 = (RpcConnectionState *)0x0;
              pRVar33 = (RpcConnectionState *)0x0;
            }
            else {
              local_3d0._16_8_ = local_308._8_8_;
              uVar46 = _iStack_2f0;
              pRVar33 = (RpcConnectionState *)local_308._0_8_;
              uVar40 = local_2e8[0]._8_4_;
            }
            pAVar34 = (AttachmentPromiseNodeBase *)operator_new(0x88);
            local_378._8_8_ = local_418.size_;
            local_378._0_8_ = local_418.ptr;
            local_498 = (RpcConnectionState *)local_418.disposer;
            local_418.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
            local_418.size_ = 0;
            local_458 = &pAVar34->dependency;
            *(undefined4 *)&(pAVar34->dependency).ptr = 0;
            (pAVar34->super_PromiseNode)._vptr_PromiseNode =
                 (_func_int **)&PTR__RpcResponseImpl_006458a8;
            (pAVar34->dependency).disposer = (Disposer *)&PTR_disposeImpl_006458d8;
            puVar1 = &(this->super_Refcounted).refcount;
            *puVar1 = *puVar1 + 1;
            pAVar34[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&this->super_Refcounted;
            pAVar34[1].dependency.disposer = (Disposer *)this;
            pAVar34[1].dependency.ptr = (PromiseNode *)message->disposer;
            pAVar34[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)message->ptr;
            message->ptr = (IncomingRpcMessage *)0x0;
            message = (Own<capnp::IncomingRpcMessage> *)&pAVar34[2].dependency;
            local_378._16_8_ = local_418.disposer;
            local_4a8._0_8_ = (RpcConnectionState *)0x0;
            local_4a8._8_8_ = (RpcConnectionState *)0x0;
            ReaderCapabilityTable::ReaderCapabilityTable
                      ((ReaderCapabilityTable *)message,
                       (Array<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)local_378);
            uVar21 = local_378._8_8_;
            uVar18 = local_378._0_8_;
            if ((RpcConnectionState *)local_378._0_8_ != (RpcConnectionState *)0x0) {
              local_378._0_8_ = (RpcConnectionState *)0x0;
              local_378._8_8_ = (RpcConnectionState *)0x0;
              (*(code *)**(undefined8 **)local_378._16_8_)
                        (local_378._16_8_,uVar18,0x10,uVar21,uVar21,
                         kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>
                         ::destruct);
            }
            local_3f8._8_8_ = local_3d0._16_8_;
            pRStack_3e0 = (RpcConnectionState *)CONCAT44(pRStack_3e0._4_4_,uVar40);
            local_3f8._0_8_ = pRVar33;
            local_3e8 = (WirePointer *)uVar46;
            PointerReader::imbue
                      ((PointerReader *)&pAVar34[3].dependency.ptr,(PointerReader *)local_3f8,
                       (CapTableReader *)message);
            uVar18 = local_4a8._8_8_;
            uVar46 = local_4a8._0_8_;
            pAVar34[5].super_PromiseNode._vptr_PromiseNode = (_func_int **)this_01;
            pAVar34[5].dependency.disposer = (Disposer *)this_01;
            ppPVar2 = &(pAVar34->dependency).ptr;
            *(int *)ppPVar2 = *(int *)ppPVar2 + 1;
            if ((RpcConnectionState *)local_4a8._0_8_ != (RpcConnectionState *)0x0) {
              local_4a8._0_8_ = (RpcConnectionState *)0x0;
              local_4a8._8_8_ = (RpcConnectionState *)0x0;
              (*(code *)((SegmentReader *)(local_498->super_ErrorHandler)._vptr_ErrorHandler)->arena
              )(local_498,uVar46,0x10,uVar18,uVar18,
                kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>::destruct
               );
            }
            local_468.disposer = (Disposer *)local_458;
            local_468.ptr = (PromiseNode *)pAVar34;
            QuestionRef::fulfill
                      (this_01,(Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>
                                *)&local_468);
            pPVar6 = local_468.ptr;
            if ((AttachmentPromiseNodeBase *)local_468.ptr != (AttachmentPromiseNodeBase *)0x0) {
              local_468.ptr = (PromiseNode *)0x0;
              (**((Disposer *)&(local_468.disposer)->_vptr_Disposer)->_vptr_Disposer)
                        (local_468.disposer,
                         (_func_int *)
                         ((long)&((PromiseNode *)&pPVar6->_vptr_PromiseNode)->_vptr_PromiseNode +
                         (long)((PromiseNode *)&pPVar6->_vptr_PromiseNode)->_vptr_PromiseNode[-2]));
            }
            sVar8 = local_418.size_;
            pMVar19 = local_418.ptr;
            if ((RpcConnectionState *)local_418.ptr != (RpcConnectionState *)0x0) {
              local_418.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
              local_418.size_ = 0;
              (*(code *)((SegmentReader *)
                        ((ErrorHandler *)&(local_418.disposer)->_vptr_ArrayDisposer)->
                        _vptr_ErrorHandler)->arena)
                        (local_418.disposer,pMVar19,0x10,sVar8,sVar8,
                         kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>
                         ::destruct);
            }
          }
          break;
        case 1:
          if (pQVar49->isTailCall == true) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[69]>
                      ((Fault *)local_308,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x9d0,FAILED,"!question->isTailCall",
                       "\"Tail call `Return` must set `resultsSentElsewhere`, not `exception`.\"",
                       (char (*) [69])
                       "Tail call `Return` must set `resultsSentElsewhere`, not `exception`.");
            kj::_::Debug::Fault::~Fault((Fault *)local_308);
          }
          else {
            if (local_430._4_2_ == 0) {
              local_428._0_4_ = 0x7fffffff;
              pRStack_448 = (RpcConnectionState *)0x0;
              local_438 = (RpcConnectionState *)0x0;
              local_450 = (undefined1  [8])0x0;
            }
            pRStack_3e0 = (RpcConnectionState *)CONCAT44(pRStack_3e0._4_4_,(int)local_428);
            local_3f8._0_8_ = local_450;
            local_3f8._8_8_ = pRStack_448;
            local_3e8 = (WirePointer *)local_438;
            PointerReader::getStruct
                      ((StructReader *)local_198,(PointerReader *)local_3f8,(word *)0x0);
            toException((Exception *)local_308,(Reader *)local_198);
            pPVar14 = (this_01->fulfiller).ptr;
            (*pPVar14->_vptr_PromiseFulfiller[1])(pPVar14,local_308);
            kj::Exception::~Exception((Exception *)local_308);
          }
          break;
        case 2:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                    ((Fault *)local_308,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x9d8,FAILED,(char *)0x0,
                     "\"Return message falsely claims call was canceled.\"",
                     (char (*) [49])"Return message falsely claims call was canceled.");
          kj::_::Debug::Fault::~Fault((Fault *)local_308);
          break;
        case 3:
          if (pQVar49->isTailCall == false) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[66]>
                      ((Fault *)local_308,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x9dd,FAILED,"question->isTailCall",
                       "\"`Return` had `resultsSentElsewhere` but this was not a tail call.\"",
                       (char (*) [66])
                       "`Return` had `resultsSentElsewhere` but this was not a tail call.");
            kj::_::Debug::Fault::~Fault((Fault *)local_308);
          }
          else {
            local_308._0_8_ = (RpcConnectionState *)0x0;
            local_308._8_8_ = (RpcConnectionState *)0x0;
            QuestionRef::fulfill
                      (this_01,(Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>
                                *)local_308);
            uVar46 = local_308._8_8_;
            if ((RpcConnectionState *)local_308._8_8_ != (RpcConnectionState *)0x0) {
              local_308._8_8_ = (RpcConnectionState *)0x0;
              (*(code *)**(undefined8 **)local_308._0_8_)
                        (local_308._0_8_,uVar46 + *(long *)(*(long *)uVar46 + -0x10));
            }
          }
          break;
        case 4:
          uVar23 = 0;
          if (0x5f < (uint)local_430) {
            uVar23 = *(uint *)&(local_440->super_Refcounted).super_Disposer._vptr_Disposer;
          }
          MVar24 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
                   ::find(&this->answers,uVar23);
          if (MVar24.ptr == (Answer *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                      ((Fault *)local_308,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x9ee,FAILED,(char *)0x0,
                       "\"`Return.takeFromOtherQuestion` had invalid answer ID.\"",
                       (char (*) [54])"`Return.takeFromOtherQuestion` had invalid answer ID.");
            kj::_::Debug::Fault::~Fault((Fault *)local_308);
          }
          else if (((MVar24.ptr)->redirectedResults).ptr.isSet == true) {
            pPVar14 = (this_01->fulfiller).ptr;
            (**pPVar14->_vptr_PromiseFulfiller)
                      (pPVar14,&((MVar24.ptr)->redirectedResults).ptr.field_1);
          }
          else {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[92]>
                      ((Fault *)local_308,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x9eb,FAILED,(char *)0x0,
                       "\"`Return.takeFromOtherQuestion` referenced a call that did not \" \"use `sendResultsTo.yourself`.\""
                       ,(char (*) [92])
                        "`Return.takeFromOtherQuestion` referenced a call that did not use `sendResultsTo.yourself`."
                      );
            kj::_::Debug::Fault::~Fault((Fault *)local_308);
          }
          break;
        default:
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                    ((Fault *)local_308,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x9f4,FAILED,(char *)0x0,"\"Unknown \'Return\' type.\"",
                     (char (*) [23])"Unknown \'Return\' type.");
          kj::_::Debug::Fault::~Fault((Fault *)local_308);
        }
        goto LAB_003c07e4;
      }
      uVar23 = 0;
      if ((uint)local_430 < 0x40) {
LAB_003c1091:
        bVar42 = false;
      }
      else {
        uVar43 = 0;
        bVar42 = false;
        if (*(short *)((long)&(local_440->super_ErrorHandler)._vptr_ErrorHandler + 6) == 4) {
          if (0x5f < (uint)local_430) {
            uVar43 = *(uint *)&(local_440->super_Refcounted).super_Disposer._vptr_Disposer;
          }
          MVar24 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
                   ::find(&this->answers,uVar43);
          if (MVar24.ptr == (Answer *)0x0) {
            bVar42 = false;
          }
          else {
            if (((MVar24.ptr)->redirectedResults).ptr.isSet != true) {
              message = (Own<capnp::IncomingRpcMessage> *)0x0;
              goto LAB_003c1091;
            }
            this_01 = (QuestionRef *)
                      ((MVar24.ptr)->redirectedResults).ptr.field_1.value.super_PromiseBase.node.
                      disposer;
            message = (Own<capnp::IncomingRpcMessage> *)
                      ((MVar24.ptr)->redirectedResults).ptr.field_1.value.super_PromiseBase.node.ptr
            ;
            ((MVar24.ptr)->redirectedResults).ptr.field_1.value.super_PromiseBase.node.ptr =
                 (PromiseNode *)0x0;
            bVar42 = true;
          }
        }
      }
      if (0x1f < (uint)local_430) {
        uVar23 = *(uint *)&(local_440->super_ErrorHandler)._vptr_ErrorHandler;
      }
      ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Question>::
      erase((Question *)local_308,&this->questions,uVar23,entry);
      uVar18 = local_308._8_8_;
      uVar46 = local_308._0_8_;
      if ((RpcConnectionState *)local_308._0_8_ != (RpcConnectionState *)0x0) {
        local_308._0_8_ = (RpcConnectionState *)0x0;
        local_308._8_8_ = (RpcConnectionState *)0x0;
        (*(code *)**(undefined8 **)local_308._16_8_)(local_308._16_8_,uVar46,4,uVar18,uVar18,0);
      }
    }
    if ((bVar42) && (message != (Own<capnp::IncomingRpcMessage> *)0x0)) {
      (*(code *)((SegmentReader *)(this_01->super_Refcounted).super_Disposer._vptr_Disposer)->arena)
                (this_01,(_func_int *)
                         ((long)&message->disposer + (long)message->disposer[-2]._vptr_Disposer));
    }
    uVar46 = local_378._48_8_;
    if ((local_378[0x40] == '\0') &&
       (pPVar6 = *(PromiseNode **)(local_378._56_8_ + 8), pPVar6 != (PromiseNode *)0x0)) {
      lVar52 = *(long *)local_378._56_8_;
      lVar50 = 0;
      do {
        releaseExport((RpcConnectionState *)uVar46,*(ExportId *)(lVar52 + lVar50),1);
        lVar50 = lVar50 + 4;
      } while ((long)pPVar6 << 2 != lVar50);
    }
    pPVar6 = local_488.ptr;
    pDVar55 = local_488.disposer;
    if ((RpcConnectionState *)local_488.disposer != (RpcConnectionState *)0x0) {
      local_488.disposer = (Disposer *)0x0;
      local_488.ptr = (PromiseNode *)0x0;
      (**(local_478->super_ErrorHandler)._vptr_ErrorHandler)(local_478,pDVar55,4,pPVar6,pPVar6,0);
    }
    break;
  case 4:
    uVar23 = 0;
    if (local_3b8._36_2_ == 0) {
      local_3b8._40_4_ = 0x7fffffff;
      local_3b8._8_8_ = (RpcConnectionState *)0x0;
      local_3b8._24_8_ = (RpcConnectionState *)0x0;
      local_3b8._0_8_ = (RpcConnectionState *)0x0;
    }
    iStack_2f0 = local_3b8._40_4_;
    local_308._0_8_ = local_3b8._0_8_;
    local_308._8_8_ = local_3b8._8_8_;
    local_308._16_8_ = local_3b8._24_8_;
    PointerReader::getStruct((StructReader *)local_450,(PointerReader *)local_308,(word *)0x0);
    local_378._8_8_ = local_3f8;
    local_3f8._0_8_ = (SegmentBuilder *)0x0;
    local_3f8._8_8_ = (CapTableBuilder *)0x0;
    local_3e8 = (WirePointer *)0x0;
    local_378._16_8_ = local_378._16_8_ & 0xffffffffffffff00;
    local_308._0_8_ = local_308._0_8_ & 0xffffffffffffff00;
    local_308._8_8_ = (CapTableReader *)0x0;
    local_308._16_8_ = (WirePointer *)0x0;
    _iStack_2f0 = _iStack_2f0 & 0xffffffffffffff00;
    local_2e8[1]._0_8_ = 0;
    local_2e8[1]._8_8_ = 0;
    local_2e8[2]._0_8_ = 0;
    local_2e8[2]._8_8_ = (undefined8 *)0x0;
    uVar43 = (uint)local_430;
    if (0x1f < (uint)local_430) {
      uVar23 = *(uint *)&(local_440->super_ErrorHandler)._vptr_ErrorHandler;
    }
    local_378._0_8_ = this;
    MVar24 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>
             ::find(&this->answers,uVar23);
    uVar18 = local_3f8._8_8_;
    uVar46 = local_3f8._0_8_;
    if ((MVar24.ptr)->active == false) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                ((Fault *)local_198,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xa12,FAILED,"answer->active","\"\'Finish\' for invalid question ID.\"",
                 (char (*) [34])"\'Finish\' for invalid question ID.");
      kj::_::Debug::Fault::~Fault((Fault *)local_198);
      pPVar54 = (PipelineHook *)0x0;
      pDVar55 = (Disposer *)0x0;
    }
    else {
      if ((uVar43 < 0x21) ||
         (((ulong)(local_440->super_ErrorHandler)._vptr_ErrorHandler & 0x100000000) == 0)) {
        if ((SegmentBuilder *)local_3f8._0_8_ != (SegmentBuilder *)0x0) {
          local_3f8._0_8_ = (SegmentBuilder *)0x0;
          local_3f8._8_8_ = (CapTableBuilder *)0x0;
          (**(_func_int **)*local_3e8)(local_3e8,uVar46,4,uVar18,uVar18,0);
        }
        local_3f8._0_8_ = ((MVar24.ptr)->resultExports).ptr;
        local_3f8._8_8_ = ((MVar24.ptr)->resultExports).size_;
        local_3e8 = (WirePointer *)((MVar24.ptr)->resultExports).disposer;
        ((MVar24.ptr)->resultExports).ptr = (uint *)0x0;
        ((MVar24.ptr)->resultExports).size_ = 0;
      }
      else {
        puVar7 = ((MVar24.ptr)->resultExports).ptr;
        if (puVar7 != (uint *)0x0) {
          sVar8 = ((MVar24.ptr)->resultExports).size_;
          ((MVar24.ptr)->resultExports).ptr = (uint *)0x0;
          ((MVar24.ptr)->resultExports).size_ = 0;
          pAVar9 = ((MVar24.ptr)->resultExports).disposer;
          (**pAVar9->_vptr_ArrayDisposer)(pAVar9,puVar7,4,sVar8,sVar8,0);
        }
      }
      pDVar55 = ((MVar24.ptr)->pipeline).ptr.disposer;
      pPVar54 = ((MVar24.ptr)->pipeline).ptr.ptr;
      ((MVar24.ptr)->pipeline).ptr.ptr = (PipelineHook *)0x0;
      pRVar28 = ((MVar24.ptr)->callContext).ptr;
      if (pRVar28 == (RpcCallContext *)0x0) {
        uVar23 = 0;
        if (0x1f < (uint)local_430) {
          uVar23 = *(uint *)&(local_440->super_ErrorHandler)._vptr_ErrorHandler;
        }
        ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>::
        erase((Answer *)local_198,&this->answers,uVar23);
        Answer::operator=((Answer *)local_308,(Answer *)local_198);
        uVar18 = local_198._64_8_;
        uVar46 = local_198._56_8_;
        if ((RpcConnectionState *)local_198._56_8_ != (RpcConnectionState *)0x0) {
          local_198._56_8_ = (RpcConnectionState *)0x0;
          local_198._64_8_ = (RpcConnectionState *)0x0;
          (*(code *)((SegmentReader *)((ErrorHandler *)auStack_150._0_8_)->_vptr_ErrorHandler)->
                    arena)(auStack_150._0_8_,uVar46,4,uVar18,uVar18,0);
        }
        uVar46 = local_198._40_8_;
        if ((local_198[0x18] == '\x01') &&
           ((RpcConnectionState *)local_198._40_8_ != (RpcConnectionState *)0x0)) {
          local_198._40_8_ = (RpcConnectionState *)0x0;
          (*(code *)((SegmentReader *)((ErrorHandler *)local_198._32_8_)->_vptr_ErrorHandler)->arena
          )(local_198._32_8_,
            (long)&((ErrorHandler *)uVar46)->_vptr_ErrorHandler +
            ((SegmentReader *)((ErrorHandler *)uVar46)->_vptr_ErrorHandler)[-1].ptr.size_);
        }
        uVar46 = local_198._16_8_;
        if ((RpcConnectionState *)local_198._16_8_ != (RpcConnectionState *)0x0) {
          local_198._16_8_ = (RpcConnectionState *)0x0;
          (*(code *)**(undefined8 **)local_198._8_8_)
                    (local_198._8_8_,uVar46 + *(long *)(*(long *)uVar46 + -0x10));
        }
      }
      else {
        bVar3 = pRVar28->cancellationFlags;
        pRVar28->cancellationFlags = bVar3 | 1;
        if (bVar3 == 2) {
          pPVar12 = (pRVar28->cancelFulfiller).ptr;
          (**pPVar12->_vptr_PromiseFulfiller)(pPVar12,local_198);
        }
      }
    }
    if (pPVar54 != (PipelineHook *)0x0) {
      (**pDVar55->_vptr_Disposer)
                (pDVar55,(_func_int *)
                         ((long)&pPVar54->_vptr_PipelineHook + (long)pPVar54->_vptr_PipelineHook[-2]
                         ));
    }
    uVar18 = local_2e8[2]._0_8_;
    uVar46 = local_2e8[1]._8_8_;
    if (local_2e8[1]._8_8_ != 0) {
      local_2e8[1]._8_8_ = 0;
      local_2e8[2]._0_8_ = 0;
      (*(code *)**(undefined8 **)local_2e8[2]._8_8_)(local_2e8[2]._8_8_,uVar46,4,uVar18,uVar18,0);
    }
    uVar46 = local_2e8[0].value.super_PromiseBase.node.ptr;
    if (((undefined1)iStack_2f0 == '\x01') &&
       ((RpcConnectionState *)local_2e8[0]._8_8_ != (RpcConnectionState *)0x0)) {
      local_2e8[0].value.super_PromiseBase.node.ptr = (RpcConnectionState *)0x0;
      (*(code *)((SegmentReader *)
                ((ErrorHandler *)&((Disposer *)local_2e8[0]._0_8_)->_vptr_Disposer)->
                _vptr_ErrorHandler)->arena)
                (local_2e8[0].value.super_PromiseBase.node.disposer,
                 (long)&((ErrorHandler *)&((PromiseNode *)uVar46)->_vptr_PromiseNode)->
                        _vptr_ErrorHandler +
                 ((SegmentReader *)
                 ((ErrorHandler *)&((PromiseNode *)uVar46)->_vptr_PromiseNode)->_vptr_ErrorHandler)
                 [-1].ptr.size_);
    }
    uVar46 = local_308._16_8_;
    if ((WirePointer *)local_308._16_8_ != (WirePointer *)0x0) {
      local_308._16_8_ = (WirePointer *)0x0;
      (***(_func_int ***)local_308._8_8_)
                (local_308._8_8_,uVar46 + *(long *)((long)*(WirePointer *)uVar46 + -0x10));
    }
    uVar46 = local_378._0_8_;
    if ((local_378[0x10] == '\0') && (lVar52 = *(long *)(local_378._8_8_ + 8), lVar52 != 0)) {
      lVar50 = *(long *)local_378._8_8_;
      lVar51 = 0;
      do {
        releaseExport((RpcConnectionState *)uVar46,*(ExportId *)(lVar50 + lVar51),1);
        lVar51 = lVar51 + 4;
      } while (lVar52 << 2 != lVar51);
    }
    uVar18 = local_3f8._8_8_;
    uVar46 = local_3f8._0_8_;
    if ((SegmentBuilder *)local_3f8._0_8_ != (SegmentBuilder *)0x0) {
      local_3f8._0_8_ = (SegmentBuilder *)0x0;
      local_3f8._8_8_ = (CapTableBuilder *)0x0;
      (**(_func_int **)*local_3e8)(local_3e8,uVar46,4,uVar18,uVar18,0);
    }
    break;
  case 5:
    if (local_3b8._36_2_ == 0) {
      local_3b8._40_4_ = 0x7fffffff;
      local_3b8._8_8_ = (RpcConnectionState *)0x0;
      local_3b8._24_8_ = (RpcConnectionState *)0x0;
      local_3b8._0_8_ = (RpcConnectionState *)0x0;
    }
    iStack_2f0 = local_3b8._40_4_;
    sVar38 = 0;
    local_308._0_8_ = local_3b8._0_8_;
    local_308._8_8_ = local_3b8._8_8_;
    local_308._16_8_ = local_3b8._24_8_;
    PointerReader::getStruct((StructReader *)local_3f8,(PointerReader *)local_308,(word *)0x0);
    local_4a8._0_8_ = (RpcConnectionState *)0x0;
    local_4a8._8_8_ = (RpcConnectionState *)0x0;
    local_308._0_8_ = local_308._0_8_ & 0xffffffffffffff00;
    if (0x2f < local_3d8) {
      sVar38 = *(short *)((long)&((ErrorHandler *)&local_3e8->offsetAndKind)->_vptr_ErrorHandler + 4
                         );
    }
    if (sVar38 == 1) {
      local_378._8_8_ = local_3f8._8_8_;
      local_378._16_8_ = pRStack_3e0;
      local_378._0_8_ = local_3f8._0_8_;
      if (local_3d4 == 0) {
        local_3d0._0_4_ = 0x7fffffff;
        local_378._8_8_ = (RpcConnectionState *)0x0;
        local_378._16_8_ = (RpcConnectionState *)0x0;
        local_378._0_8_ = (RpcConnectionState *)0x0;
      }
      local_378._24_4_ = local_3d0._0_4_;
      PointerReader::getStruct((StructReader *)local_450,(PointerReader *)local_378,(word *)0x0);
      toException((Exception *)local_198,(Reader *)local_450);
      if (local_308[0] == '\x01') {
        local_308._0_8_ = local_308._0_8_ & 0xffffffffffffff00;
        kj::Exception::~Exception((Exception *)(local_308 + 8));
      }
      local_308._8_8_ = local_198._0_8_;
      local_308._16_8_ = local_198._8_8_;
      _iStack_2f0 = local_198._16_8_;
      local_198._0_8_ = (RpcConnectionState *)0x0;
      local_198._8_8_ = (RpcConnectionState *)0x0;
      local_2e8[0].value.super_PromiseBase.node.disposer = local_198._24_8_;
      local_2e8[0].value.super_PromiseBase.node.ptr = local_198._32_8_;
      local_2e8[1]._0_8_ = local_198._40_8_;
      local_2e8[1]._8_8_ = local_198._48_8_;
      local_2e8[2]._0_8_ = local_198._56_8_;
      local_2e8[2]._8_8_ = local_198._64_8_;
      local_198._40_8_ = (RpcConnectionState *)0x0;
      local_198._48_8_ = (RpcConnectionState *)0x0;
      local_2b8 = auStack_150._0_8_;
      auStack_150._0_8_ = (RpcConnectionState *)0x0;
      memcpy(local_2b0,
             &(((anon_union_16_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcResponse>_>_>_2
                 *)auStack_150)->value).super_PromiseBase.node.ptr,0x104);
      local_308[0] = 1;
      kj::Exception::~Exception((Exception *)local_198);
LAB_003c1b0e:
      uVar23 = 0;
      if (0x1f < local_3d8) {
        uVar23 = *(uint *)&((ErrorHandler *)&local_3e8->offsetAndKind)->_vptr_ErrorHandler;
      }
      MVar32 = ImportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Import>
               ::find(&this->imports,uVar23);
      if (MVar32.ptr != (Import *)0x0) {
        if (((MVar32.ptr)->promiseFulfiller).ptr.ptr ==
            (PromiseFulfiller<kj::Own<capnp::ClientHook>_> *)0x0) {
          if (((MVar32.ptr)->importClient).ptr != (ImportClient *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
                      ((Fault *)local_450,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0xa50,FAILED,(char *)0x0,"\"Got \'Resolve\' for a non-promise import.\"",
                       (char (*) [40])"Got \'Resolve\' for a non-promise import.");
            kj::_::Debug::Fault::~Fault((Fault *)local_450);
          }
        }
        else if (local_308[0] == '\x01') {
          pPVar13 = ((MVar32.ptr)->promiseFulfiller).ptr.ptr;
          (*pPVar13->_vptr_PromiseFulfiller[1])(pPVar13,local_308 + 8);
        }
        else {
          pPVar13 = ((MVar32.ptr)->promiseFulfiller).ptr.ptr;
          (**pPVar13->_vptr_PromiseFulfiller)(pPVar13,local_4a8);
        }
      }
    }
    else if (sVar38 == 0) {
      pRStack_448 = (RpcConnectionState *)local_3f8._8_8_;
      local_440 = pRStack_3e0;
      local_450 = (undefined1  [8])local_3f8._0_8_;
      if (local_3d4 == 0) {
        local_3d0._0_4_ = 0x7fffffff;
        pRStack_448 = (RpcConnectionState *)0x0;
        local_440 = (RpcConnectionState *)0x0;
        local_450 = (undefined1  [8])(RpcConnectionState *)0x0;
      }
      local_438 = (RpcConnectionState *)CONCAT44(local_438._4_4_,local_3d0._0_4_);
      PointerReader::getStruct((StructReader *)local_198,(PointerReader *)local_450,(word *)0x0);
      descriptor._reader.capTable = (CapTableReader *)local_198._8_8_;
      descriptor._reader.segment = (SegmentReader *)local_198._0_8_;
      descriptor._reader.data = (void *)local_198._16_8_;
      descriptor._reader.pointers = (WirePointer *)local_198._24_8_;
      descriptor._reader.dataSize = local_198._32_4_;
      descriptor._reader.pointerCount = local_198._36_2_;
      descriptor._reader._38_2_ = local_198._38_2_;
      descriptor._reader._40_8_ = local_198._40_8_;
      MVar58 = receiveCap((RpcConnectionState *)local_378,descriptor);
      uVar21 = local_378._8_8_;
      uVar18 = local_4a8._8_8_;
      uVar46 = local_4a8._0_8_;
      if ((RpcConnectionState *)local_378._8_8_ == (RpcConnectionState *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
                  ((Fault *)local_450,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0xa35,FAILED,(char *)0x0,"\"\'Resolve\' contained \'CapDescriptor.none\'.\"",
                   (char (*) [42])"\'Resolve\' contained \'CapDescriptor.none\'.");
        kj::_::Debug::Fault::~Fault((Fault *)local_450);
      }
      else {
        local_4a8._0_8_ = local_378._0_8_;
        local_4a8._8_8_ = local_378._8_8_;
        if ((RpcConnectionState *)uVar18 != (RpcConnectionState *)0x0) {
          (**(code **)*(_func_int **)uVar46)
                    (uVar46,uVar18 + *(long *)(*(_func_int **)uVar18 + -0x10),MVar58.ptr.ptr);
        }
      }
      if ((RpcConnectionState *)uVar21 != (RpcConnectionState *)0x0) goto LAB_003c1b0e;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                ((Fault *)local_198,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xa41,FAILED,(char *)0x0,"\"Unknown \'Resolve\' type.\"",
                 (char (*) [24])"Unknown \'Resolve\' type.");
      kj::_::Debug::Fault::~Fault((Fault *)local_198);
    }
    if (local_308[0] == '\x01') {
      kj::Exception::~Exception((Exception *)(local_308 + 8));
    }
    goto LAB_003c1c3a;
  case 6:
    id = 0;
    if (local_3b8._36_2_ == 0) {
      local_3b8._40_4_ = 0x7fffffff;
      local_3b8._8_8_ = (RpcConnectionState *)0x0;
      local_3b8._24_8_ = (RpcConnectionState *)0x0;
      local_3b8._0_8_ = (RpcConnectionState *)0x0;
    }
    local_198._24_4_ = local_3b8._40_4_;
    local_198._0_8_ = local_3b8._0_8_;
    local_198._8_8_ = local_3b8._8_8_;
    local_198._16_8_ = local_3b8._24_8_;
    PointerReader::getStruct((StructReader *)local_308,(PointerReader *)local_198,(word *)0x0);
    if (0x1f < (uint)local_2e8[0]._0_4_) {
      id = *(ExportId *)local_308._16_8_;
    }
    refcount = 0;
    if (0x3f < (uint)local_2e8[0]._0_4_) {
      refcount = *(uint *)(local_308._16_8_ + 4);
    }
LAB_003c24b9:
    releaseExport(this,id,refcount);
    break;
  default:
    if ((this->connection).tag != 1) {
      return;
    }
    puVar4 = *(undefined8 **)((long)&(this->connection).field_1 + 8);
    MVar56 = StructReader::totalSize((StructReader *)local_3b8);
    uVar36 = (ulong)(MVar56.capCount << 2) + MVar56.wordCount;
    if (0xfffff < uVar36) {
      uVar36 = 0x100000;
    }
    (**(code **)*puVar4)(local_4a8,puVar4,(int)uVar36 + 3);
    (**(code **)*(_func_int **)local_4a8._8_8_)(local_378);
    local_308._16_8_ = local_378._16_8_;
    local_308._0_8_ = local_378._0_8_;
    local_308._8_8_ = local_378._8_8_;
    PointerBuilder::initStruct
              ((StructBuilder *)local_450,(PointerBuilder *)local_308,(StructSize)0x10001);
    local_2e8[0]._0_8_ = CONCAT26(local_3b8._38_2_,CONCAT24(local_3b8._36_2_,local_3b8._32_4_));
    local_2e8[0]._8_8_ = CONCAT44(local_3b8._44_4_,local_3b8._40_4_);
    local_198._16_8_ = local_3b8._16_8_;
    local_198._24_8_ = local_3b8._24_8_;
    local_198._0_8_ = local_3b8._0_8_;
    local_198._8_8_ = local_3b8._8_8_;
    *(undefined2 *)&(local_440->super_ErrorHandler)._vptr_ErrorHandler = 0;
    local_308._16_8_ = local_3b8._16_8_;
    _iStack_2f0 = local_3b8._24_8_;
    local_308._0_8_ = local_3b8._0_8_;
    local_308._8_8_ = local_3b8._8_8_;
    local_3f8._0_8_ = local_450;
    local_3f8._8_8_ = pRStack_448;
    local_3e8 = (WirePointer *)local_438;
    local_198._40_8_ = local_2e8[0]._8_8_;
    PointerBuilder::setStruct((PointerBuilder *)local_3f8,(StructReader *)local_308,false);
    (**(code **)(*(_func_int **)local_4a8._8_8_ + 8))();
LAB_003c1c3a:
    pRVar45 = (RpcConnectionState *)local_4a8._8_8_;
    if ((RpcConnectionState *)local_4a8._8_8_ == (RpcConnectionState *)0x0) {
      return;
    }
    local_4a8._8_8_ = (RpcConnectionState *)0x0;
    pRVar33 = (RpcConnectionState *)local_4a8._0_8_;
    goto LAB_003c22f3;
  case 8:
    uVar40 = 0;
    if (local_3b8._36_2_ == 0) {
      local_3b8._40_4_ = 0x7fffffff;
      local_3b8._8_8_ = (RpcConnectionState *)0x0;
      local_3b8._24_8_ = (RpcConnectionState *)0x0;
      local_3b8._0_8_ = (RpcConnectionState *)0x0;
    }
    iStack_2f0 = local_3b8._40_4_;
    local_308._0_8_ = local_3b8._0_8_;
    local_308._8_8_ = local_3b8._8_8_;
    local_308._16_8_ = local_3b8._24_8_;
    PointerReader::getStruct((StructReader *)local_3f8,(PointerReader *)local_308,(word *)0x0);
    if (0x1f < local_3d8) {
      uVar40 = *(undefined4 *)&((ErrorHandler *)&local_3e8->offsetAndKind)->_vptr_ErrorHandler;
    }
    local_468.disposer = (Disposer *)CONCAT44(local_468.disposer._4_4_,uVar40);
    if ((this->connection).tag != 1) {
      return;
    }
    pRVar33 = *(RpcConnectionState **)((long)&(this->connection).field_1 + 8);
    (*(code *)((SegmentReader *)(pRVar33->super_ErrorHandler)._vptr_ErrorHandler)->arena)
              (local_378 + 0x30,pRVar33,0x28);
    (*(code *)**(undefined8 **)local_378._56_8_)(local_450);
    local_198._16_8_ = local_440;
    local_198._0_8_ = local_450;
    local_198._8_8_ = pRStack_448;
    PointerBuilder::getStruct
              ((StructBuilder *)local_308,(PointerBuilder *)local_198,(StructSize)0x10001,
               (word *)0x0);
    *(undefined2 *)local_308._16_8_ = 3;
    local_198._0_8_ = local_308._0_8_;
    local_198._8_8_ = local_308._8_8_;
    local_198._16_8_ = _iStack_2f0;
    PointerBuilder::initStruct
              ((StructBuilder *)local_378,(PointerBuilder *)local_198,(StructSize)0x10002);
    *(undefined4 *)local_378._16_8_ = local_468.disposer._0_4_;
    local_420 = &local_418;
    local_418.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    local_418.size_ = 0;
    local_488.ptr = (PromiseNode *)local_4a8;
    local_4a8._0_8_ = (RpcConnectionState *)0x0;
    local_4a8._8_8_ = (RpcConnectionState *)0x0;
    local_498 = (RpcConnectionState *)0x0;
    local_478 = (RpcConnectionState *)((ulong)local_478 & 0xffffffffffffff00);
    local_450 = (undefined1  [8])&PTR_run_00643fd0;
    local_488.disposer = (Disposer *)this;
    pRStack_448 = (RpcConnectionState *)local_3f8;
    local_440 = this;
    local_438 = pRVar33;
    local_430 = (StructBuilder *)local_378;
    local_428 = (RpcCallContext *)local_488.ptr;
    kj::_::runCatchingExceptions((Maybe<kj::Exception> *)local_198,(Runnable *)local_450);
    local_308[0] = local_198[0];
    if (local_198[0] == '\x01') {
      local_308._8_8_ = local_198._8_8_;
      local_308._16_8_ = local_198._16_8_;
      _iStack_2f0 = local_198._24_8_;
      local_198._8_8_ = (RpcConnectionState *)0x0;
      local_198._16_8_ = (RpcConnectionState *)0x0;
      local_2e8[0].value.super_PromiseBase.node.disposer = local_198._32_8_;
      local_2e8[0].value.super_PromiseBase.node.ptr = local_198._40_8_;
      local_2e8[1]._0_8_ = local_198._48_8_;
      local_2e8[1]._8_8_ = local_198._56_8_;
      local_2e8[2]._0_8_ = local_198._64_8_;
      local_2e8[2]._8_8_ = auStack_150._0_8_;
      local_198._48_8_ = (RpcConnectionState *)0x0;
      local_198._56_8_ = (RpcConnectionState *)0x0;
      local_2b8 = auStack_150._8_8_;
      auStack_150._8_8_ = (RpcConnectionState *)0x0;
      memcpy(local_2b0,local_140,0x104);
      kj::Exception::~Exception((Exception *)(local_198 + 8));
    }
    exception = (Exception *)(local_308 + 8);
    if (local_308[0] == '\x01') {
      *(undefined2 *)(local_378._16_8_ + 6) = 1;
      local_450 = (undefined1  [8])local_378._0_8_;
      pRStack_448 = (RpcConnectionState *)local_378._8_8_;
      local_440 = (RpcConnectionState *)local_378._24_8_;
      PointerBuilder::initStruct
                ((StructBuilder *)local_198,(PointerBuilder *)local_450,(StructSize)0x10001);
      builder._builder.capTable = (CapTableBuilder *)local_198._8_8_;
      builder._builder.segment = (SegmentBuilder *)local_198._0_8_;
      builder._builder.data = (void *)local_198._16_8_;
      builder._builder.pointers = (WirePointer *)local_198._24_8_;
      builder._builder.dataSize = local_198._32_4_;
      builder._builder.pointerCount = local_198._36_2_;
      builder._builder._38_2_ = local_198._38_2_;
      fromException(exception,builder);
      OVar57 = newBrokenCap((capnp *)local_450,exception);
      pMVar19 = local_418.ptr;
      pRVar33 = pRStack_448;
      pRStack_448 = (RpcConnectionState *)0x0;
      pRVar45 = (RpcConnectionState *)local_450;
      if ((RpcConnectionState *)local_418.size_ != (RpcConnectionState *)0x0) {
        pEVar15 = (ErrorHandler *)local_418.size_;
        pEVar16 = (ErrorHandler *)local_418.size_;
        pEVar17 = (ErrorHandler *)&(local_418.ptr)->ptr;
        local_418.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)(RpcConnectionState *)local_450;
        local_418.size_ = (size_t)pRVar33;
        (*(code *)((SegmentReader *)pEVar17->_vptr_ErrorHandler)->arena)
                  (pMVar19,(long)&pEVar16->_vptr_ErrorHandler +
                           ((SegmentReader *)pEVar15->_vptr_ErrorHandler)[-1].ptr.size_,OVar57.ptr);
        pRVar45 = (RpcConnectionState *)local_418.ptr;
        pRVar33 = (RpcConnectionState *)local_418.size_;
      }
      local_418.size_ = (size_t)pRVar33;
      local_418.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)pRVar45;
      pRVar33 = pRStack_448;
      if (pRStack_448 != (RpcConnectionState *)0x0) {
        pRStack_448 = (RpcConnectionState *)0x0;
        (**(code **)*(_func_int **)local_450)
                  (local_450,
                   (long)&(pRVar33->super_ErrorHandler)._vptr_ErrorHandler +
                   ((SegmentReader *)(pRVar33->super_ErrorHandler)._vptr_ErrorHandler)[-1].ptr.size_
                  );
      }
    }
    if (local_308[0] == '\x01') {
      kj::Exception::~Exception(exception);
    }
    pIVar5 = message->ptr;
    if (pIVar5 != (IncomingRpcMessage *)0x0) {
      message->ptr = (IncomingRpcMessage *)0x0;
      (**message->disposer->_vptr_Disposer)
                (message->disposer,
                 (_func_int *)
                 ((long)&pIVar5->_vptr_IncomingRpcMessage +
                 (long)pIVar5->_vptr_IncomingRpcMessage[-2]));
    }
    local_308._0_4_ = local_468.disposer._0_4_;
    if (((ulong)local_468.disposer & 0xffffffff) < 0x10) {
      pmVar25 = (mapped_type *)&(this->answers).low[(ulong)local_468.disposer & 0xffffffff].active;
    }
    else {
      pmVar25 = std::
                unordered_map<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Answer>_>_>
                ::operator[](&(this->answers).high,(key_type *)local_308);
    }
    if (pmVar25->active == false) {
      puVar7 = (pmVar25->resultExports).ptr;
      if (puVar7 != (uint *)0x0) {
        sVar8 = (pmVar25->resultExports).size_;
        (pmVar25->resultExports).ptr = (uint *)0x0;
        (pmVar25->resultExports).size_ = 0;
        pAVar9 = (pmVar25->resultExports).disposer;
        (**pAVar9->_vptr_ArrayDisposer)(pAVar9,puVar7,4,sVar8,sVar8,0);
      }
      (pmVar25->resultExports).ptr = (uint *)local_4a8._0_8_;
      (pmVar25->resultExports).size_ = local_4a8._8_8_;
      (pmVar25->resultExports).disposer = (ArrayDisposer *)local_498;
      local_4a8._0_8_ = (RpcConnectionState *)0x0;
      local_4a8._8_8_ = (RpcConnectionState *)0x0;
      pmVar25->active = true;
      pPVar26 = (PipelineHook *)operator_new(0x28);
      *(undefined4 *)&pPVar26[2]._vptr_PipelineHook = 0;
      pPVar26->_vptr_PipelineHook = (_func_int **)&PTR_addRef_00644110;
      pPVar26[1]._vptr_PipelineHook = (_func_int **)&DAT_00644148;
      pPVar26[3]._vptr_PipelineHook = (_func_int **)local_418.ptr;
      pPVar26[4]._vptr_PipelineHook = (_func_int **)local_418.size_;
      local_418.size_ = 0;
      *(undefined4 *)&pPVar26[2]._vptr_PipelineHook = 1;
      pDVar55 = (pmVar25->pipeline).ptr.disposer;
      pPVar54 = (pmVar25->pipeline).ptr.ptr;
      (pmVar25->pipeline).ptr.disposer = (Disposer *)(pPVar26 + 1);
      (pmVar25->pipeline).ptr.ptr = pPVar26;
      if (pPVar54 != (PipelineHook *)0x0) {
        (**pDVar55->_vptr_Disposer)
                  (pDVar55,(_func_int *)
                           ((long)&pPVar54->_vptr_PipelineHook +
                           (long)pPVar54->_vptr_PipelineHook[-2]));
      }
      (**(code **)(*(long *)local_378._56_8_ + 8))();
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29],unsigned_int&>
                ((Fault *)local_308,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x8e4,FAILED,"!answer.active","\"questionId is already in use\", answerId",
                 (char (*) [29])"questionId is already in use",(uint *)&local_468);
      kj::_::Debug::Fault::~Fault((Fault *)local_308);
    }
    pDVar55 = local_488.disposer;
    if (((char)local_478 == '\0') &&
       (pp_Var10 = (((Refcounted *)((long)local_488.ptr + 8))->super_Disposer)._vptr_Disposer,
       pp_Var10 != (_func_int **)0x0)) {
      pp_Var11 = ((CallContextHook *)&(local_488.ptr)->_vptr_PromiseNode)->_vptr_CallContextHook;
      lVar52 = 0;
      do {
        releaseExport((RpcConnectionState *)pDVar55,*(ExportId *)((long)pp_Var11 + lVar52),1);
        lVar52 = lVar52 + 4;
      } while ((long)pp_Var10 << 2 != lVar52);
    }
    uVar18 = local_4a8._8_8_;
    uVar46 = local_4a8._0_8_;
    if ((RpcConnectionState *)local_4a8._0_8_ != (RpcConnectionState *)0x0) {
      local_4a8._0_8_ = (RpcConnectionState *)0x0;
      local_4a8._8_8_ = (RpcConnectionState *)0x0;
      (*(code *)((SegmentReader *)(local_498->super_ErrorHandler)._vptr_ErrorHandler)->arena)
                (local_498,uVar46,4,uVar18,uVar18,0);
    }
    sVar8 = local_418.size_;
    if ((RpcConnectionState *)local_418.size_ != (RpcConnectionState *)0x0) {
      local_418.size_ = 0;
      (*(code *)((SegmentReader *)((ErrorHandler *)&(local_418.ptr)->ptr)->_vptr_ErrorHandler)->
                arena)(local_418.ptr,
                       (long)&((ErrorHandler *)sVar8)->_vptr_ErrorHandler +
                       ((SegmentReader *)((ErrorHandler *)sVar8)->_vptr_ErrorHandler)[-1].ptr.size_)
      ;
    }
    pRVar45 = (RpcConnectionState *)local_378._56_8_;
    if ((RpcConnectionState *)local_378._56_8_ == (RpcConnectionState *)0x0) {
      return;
    }
    local_378._56_8_ = (RpcConnectionState *)0x0;
    pRVar33 = (RpcConnectionState *)local_378._48_8_;
LAB_003c22f3:
    p_Var48 = (_func_int *)
              ((long)&(pRVar45->super_ErrorHandler)._vptr_ErrorHandler +
              ((SegmentReader *)(pRVar45->super_ErrorHandler)._vptr_ErrorHandler)[-1].ptr.size_);
    pSVar35 = (SegmentReader *)(pRVar33->super_ErrorHandler)._vptr_ErrorHandler;
LAB_003c22fd:
    (*(code *)pSVar35->arena)(pRVar33,p_Var48);
    break;
  case 0xd:
    if (local_3b8._36_2_ == 0) {
      local_3b8._40_4_ = 0x7fffffff;
      local_3b8._8_8_ = (RpcConnectionState *)0x0;
      local_3b8._24_8_ = (RpcConnectionState *)0x0;
      local_3b8._0_8_ = (RpcConnectionState *)0x0;
    }
    iStack_2f0 = local_3b8._40_4_;
    sVar38 = 0;
    local_308._0_8_ = local_3b8._0_8_;
    local_308._8_8_ = local_3b8._8_8_;
    local_308._16_8_ = local_3b8._24_8_;
    PointerReader::getStruct((StructReader *)local_198,(PointerReader *)local_308,(word *)0x0);
    uVar46 = local_198._16_8_;
    if (0x2f < (uint)local_198._32_4_) {
      sVar38 = *(short *)(local_198._16_8_ + 4);
    }
    if (sVar38 == 1) {
      if ((uint)local_198._32_4_ < 0x20) {
        uVar36 = 0;
      }
      else {
        uVar36 = (ulong)*(uint *)local_198._16_8_;
      }
      pEVar27 = (this->embargoes).slots.builder.ptr;
      if ((uVar36 < (ulong)((long)(this->embargoes).slots.builder.pos - (long)pEVar27 >> 4)) &&
         (pEVar27[uVar36].fulfiller.ptr.ptr != (PromiseFulfiller<void> *)0x0)) {
        pEVar27 = pEVar27 + uVar36;
      }
      else {
        pEVar27 = (Embargo *)0x0;
      }
      if (pEVar27 == (Embargo *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
                  ((Fault *)local_308,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0xab8,FAILED,(char *)0x0,
                   "\"Invalid embargo ID in \'Disembargo.context.receiverLoopback\'.\"",
                   (char (*) [61])"Invalid embargo ID in \'Disembargo.context.receiverLoopback\'.");
        goto LAB_003c1aa4;
      }
      pPVar12 = (pEVar27->fulfiller).ptr.ptr;
      if (pPVar12 == (PromiseFulfiller<void> *)0x0) {
        local_450 = (undefined1  [8])0x0;
        local_308._0_8_ = (SegmentBuilder *)0x0;
        local_308._8_8_ = (CapTableReader *)0x0;
        kj::_::Debug::Fault::init
                  ((Fault *)local_450,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)local_450);
      }
      (**pPVar12->_vptr_PromiseFulfiller)(pPVar12,local_308);
      uVar23 = 0;
      if (0x1f < (uint)local_198._32_4_) {
        uVar23 = *(uint *)uVar46;
      }
      local_308._0_4_ = uVar23;
      pEVar27 = (this->embargoes).slots.builder.ptr;
      pRVar33 = (RpcConnectionState *)pEVar27[uVar23].fulfiller.ptr.disposer;
      pPVar12 = pEVar27[uVar23].fulfiller.ptr.ptr;
      pEVar27[uVar23].fulfiller.ptr.disposer = (Disposer *)0x0;
      pEVar27[uVar23].fulfiller.ptr.ptr = (PromiseFulfiller<void> *)0x0;
      std::
      priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
      ::push(&(this->embargoes).freeIds,(value_type *)local_308);
      if (pPVar12 == (PromiseFulfiller<void> *)0x0) {
        return;
      }
      p_Var48 = (_func_int *)
                ((long)&pPVar12->_vptr_PromiseFulfiller + (long)pPVar12->_vptr_PromiseFulfiller[-2])
      ;
      pSVar35 = (SegmentReader *)(pRVar33->super_ErrorHandler)._vptr_ErrorHandler;
    }
    else {
      if (sVar38 != 0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,char_const(&)[31],capnp::rpc::Disembargo::Reader_const&>
                  ((Fault *)local_308,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0xac0,FAILED,(char *)0x0,"\"Unimplemented Disembargo type.\", disembargo",
                   (char (*) [31])"Unimplemented Disembargo type.",(Reader *)local_198);
LAB_003c1aa4:
        kj::_::Debug::Fault::~Fault((Fault *)local_308);
        return;
      }
      if (local_198._36_2_ == 0) {
        iVar39 = 0x7fffffff;
        pRStack_448 = (RpcConnectionState *)0x0;
        local_440 = (RpcConnectionState *)0x0;
        local_450 = (undefined1  [8])0x0;
      }
      else {
        pRStack_448 = (RpcConnectionState *)local_198._8_8_;
        local_440 = (RpcConnectionState *)local_198._24_8_;
        local_450 = (undefined1  [8])local_198._0_8_;
        iVar39 = local_198._40_4_;
      }
      local_438 = (RpcConnectionState *)CONCAT44(local_438._4_4_,iVar39);
      PointerReader::getStruct((StructReader *)local_308,(PointerReader *)local_450,(word *)0x0);
      getMessageTarget((RpcConnectionState *)local_3f8,(Reader *)this);
      pRVar33 = (RpcConnectionState *)local_3f8._8_8_;
      pRVar45 = (RpcConnectionState *)local_3f8._8_8_;
      if ((RpcConnectionState *)local_3f8._8_8_ != (RpcConnectionState *)0x0) {
        local_458 = (Own<kj::_::PromiseNode> *)CONCAT44(local_458._4_4_,local_198._32_4_);
        local_3d0._16_8_ = uVar46;
        pRVar30 = (RpcConnectionState *)local_3f8._0_8_;
        pRVar44 = (RpcConnectionState *)local_3f8._8_8_;
        do {
          plVar29 = (long *)(*(code *)(((SegmentReader *)
                                       (pRVar44->super_ErrorHandler)._vptr_ErrorHandler)->ptr).ptr)
                                      (pRVar44);
          pRVar33 = pRVar30;
          pRVar45 = pRVar44;
          if (plVar29 != (long *)0x0) {
            (**(code **)(*plVar29 + 0x20))(local_308,plVar29);
            pRVar45 = (RpcConnectionState *)local_308._8_8_;
            pRVar33 = (RpcConnectionState *)local_308._0_8_;
            local_308._8_8_ = (RpcConnectionState *)0x0;
            (*(code *)((SegmentReader *)(pRVar30->super_ErrorHandler)._vptr_ErrorHandler)->arena)
                      (pRVar30,(long)&(pRVar44->super_ErrorHandler)._vptr_ErrorHandler +
                               ((SegmentReader *)(pRVar44->super_ErrorHandler)._vptr_ErrorHandler)
                               [-1].ptr.size_);
            uVar46 = local_308._8_8_;
            if ((RpcConnectionState *)local_308._8_8_ != (RpcConnectionState *)0x0) {
              local_308._8_8_ = (RpcConnectionState *)0x0;
              (*(code *)**(undefined8 **)local_308._0_8_)
                        (local_308._0_8_,uVar46 + *(long *)(*(long *)uVar46 + -0x10));
            }
          }
          pRVar30 = pRVar33;
          pRVar44 = pRVar45;
        } while (plVar29 != (long *)0x0);
        pRVar30 = (RpcConnectionState *)
                  (*(code *)((SegmentReader *)(pRVar45->super_ErrorHandler)._vptr_ErrorHandler)[1].
                            arena)(pRVar45);
        if (pRVar30 == this) {
          uVar40 = 0;
          if (0x1f < (uint)local_458) {
            uVar40 = *(undefined4 *)local_3d0._16_8_;
          }
          kj::_::yield();
          pTVar31 = (TransformPromiseNodeBase *)operator_new(0x48);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar31,(Own<kj::_::PromiseNode> *)local_308,
                     kj::
                     CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2705:21),_kj::Own<capnp::ClientHook>_>
                     ::operator()<>);
          uVar46 = local_308._8_8_;
          (pTVar31->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00645938;
          pTVar31[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
          *(undefined4 *)&pTVar31[1].dependency.disposer = uVar40;
          pTVar31[1].dependency.ptr = (PromiseNode *)pRVar33;
          pTVar31[1].continuationTracePtr = pRVar45;
          local_450 = (undefined1  [8])
                      &kj::_::
                       HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::Own<capnp::ClientHook>>,kj::_::PropagateException>>
                       ::instance;
          pRStack_448 = (RpcConnectionState *)pTVar31;
          if ((RpcConnectionState *)local_308._8_8_ != (RpcConnectionState *)0x0) {
            local_308._8_8_ = (RpcConnectionState *)0x0;
            (*(code *)**(undefined8 **)local_308._0_8_)
                      (local_308._0_8_,uVar46 + *(long *)(*(long *)uVar46 + -0x10));
          }
          kj::TaskSet::add(&this->tasks,(Promise<void> *)local_450);
          pRVar33 = pRStack_448;
          if (pRStack_448 == (RpcConnectionState *)0x0) {
            return;
          }
          pRStack_448 = (RpcConnectionState *)0x0;
          (**(code **)*(_func_int **)local_450)
                    (local_450,
                     (_func_int *)
                     ((long)&((PromiseNode *)&pRVar33->super_ErrorHandler)->_vptr_PromiseNode +
                     (long)((PromiseNode *)&pRVar33->super_ErrorHandler)->_vptr_PromiseNode[-2]));
          return;
        }
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[96]>
                  ((Fault *)local_308,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0xa88,FAILED,"target->getBrand() == this",
                   "\"\'Disembargo\' of type \'senderLoopback\' sent to an object that does not point \" \"back to the sender.\""
                   ,(char (*) [96])
                    "\'Disembargo\' of type \'senderLoopback\' sent to an object that does not point back to the sender."
                  );
        kj::_::Debug::Fault::~Fault((Fault *)local_308);
      }
      if (pRVar45 == (RpcConnectionState *)0x0) {
        return;
      }
      p_Var48 = (_func_int *)
                ((long)&(pRVar45->super_ErrorHandler)._vptr_ErrorHandler +
                ((SegmentReader *)(pRVar45->super_ErrorHandler)._vptr_ErrorHandler)[-1].ptr.size_);
      pSVar35 = (SegmentReader *)(pRVar33->super_ErrorHandler)._vptr_ErrorHandler;
    }
    goto LAB_003c22fd;
  }
  return;
}

Assistant:

void handleMessage(kj::Own<IncomingRpcMessage> message) {
    auto reader = message->getBody().getAs<rpc::Message>();

    switch (reader.which()) {
      case rpc::Message::UNIMPLEMENTED:
        handleUnimplemented(reader.getUnimplemented());
        break;

      case rpc::Message::ABORT:
        handleAbort(reader.getAbort());
        break;

      case rpc::Message::BOOTSTRAP:
        handleBootstrap(kj::mv(message), reader.getBootstrap());
        break;

      case rpc::Message::CALL:
        handleCall(kj::mv(message), reader.getCall());
        break;

      case rpc::Message::RETURN:
        handleReturn(kj::mv(message), reader.getReturn());
        break;

      case rpc::Message::FINISH:
        handleFinish(reader.getFinish());
        break;

      case rpc::Message::RESOLVE:
        handleResolve(reader.getResolve());
        break;

      case rpc::Message::RELEASE:
        handleRelease(reader.getRelease());
        break;

      case rpc::Message::DISEMBARGO:
        handleDisembargo(reader.getDisembargo());
        break;

      default: {
        if (connection.is<Connected>()) {
          auto message = connection.get<Connected>()->newOutgoingMessage(
              firstSegmentSize(reader.totalSize(), messageSizeHint<void>()));
          message->getBody().initAs<rpc::Message>().setUnimplemented(reader);
          message->send();
        }
        break;
      }
    }
  }